

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNv_intersector.h
# Opt level: O1

bool embree::avx512::CurveNvIntersectorK<8,4>::
     occluded_t<embree::avx512::SweepCurve1IntersectorK<embree::BSplineCurveT,4>,embree::avx512::Occluded1KEpilog1<4,true>>
               (Precalculations *pre,RayK<4> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  undefined1 auVar1 [16];
  Primitive PVar2;
  Geometry *pGVar3;
  RTCFilterFunctionN p_Var4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  int iVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  float fVar30;
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [12];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  byte bVar69;
  byte bVar70;
  byte bVar71;
  ulong uVar72;
  byte bVar73;
  ulong uVar74;
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  Primitive *pPVar75;
  byte bVar76;
  long lVar77;
  bool bVar78;
  bool bVar79;
  ulong uVar80;
  uint uVar81;
  undefined1 auVar91 [16];
  uint uVar140;
  uint uVar141;
  uint uVar143;
  uint uVar144;
  uint uVar145;
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  uint uVar142;
  uint uVar146;
  undefined1 auVar132 [32];
  undefined1 auVar90 [16];
  undefined1 auVar133 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  float pp;
  float fVar147;
  undefined4 uVar148;
  float fVar149;
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  float fVar167;
  float fVar168;
  float fVar169;
  float fVar170;
  float fVar171;
  float fVar172;
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [32];
  undefined1 auVar188 [32];
  undefined1 auVar189 [32];
  undefined1 auVar190 [32];
  float fVar191;
  float fVar210;
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  float fVar192;
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [32];
  float fVar208;
  float fVar209;
  undefined1 auVar207 [64];
  float fVar211;
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [32];
  undefined1 auVar217 [32];
  undefined1 auVar218 [32];
  undefined1 auVar219 [32];
  undefined1 auVar220 [64];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  float fVar231;
  float fVar232;
  undefined1 auVar226 [32];
  undefined1 auVar227 [32];
  undefined1 auVar228 [32];
  undefined1 auVar229 [32];
  undefined1 auVar230 [32];
  float fVar234;
  undefined1 auVar233 [64];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  float fVar237;
  float fVar238;
  float fVar239;
  undefined1 auVar240 [32];
  undefined1 auVar241 [64];
  float fVar242;
  float fVar244;
  float fVar245;
  float fVar246;
  float fVar247;
  undefined1 auVar243 [64];
  float fVar248;
  undefined1 auVar249 [64];
  float fVar252;
  undefined1 auVar250 [32];
  undefined1 auVar251 [64];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar257 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [64];
  RTCFilterFunctionNArguments args;
  Vec3fa dir;
  vfloatx_conflict vu0;
  vfloatx_conflict u_outer1;
  vfloatx_conflict u_outer0;
  BBox<embree::vfloat_impl<8>_> tp1;
  vfloat<8> dOdO;
  BBox<embree::vfloat_impl<8>_> tp0;
  StackEntry stack [3];
  undefined8 local_8f0;
  undefined8 uStack_8e8;
  uint local_8d4;
  uint local_8d0;
  undefined4 local_8cc;
  float local_8c8;
  float local_8c4;
  undefined1 local_8c0 [32];
  undefined1 local_890 [16];
  Primitive *local_878;
  Primitive *local_870;
  ulong local_868;
  ulong local_860;
  ulong local_858;
  RTCFilterFunctionNArguments local_850;
  undefined1 local_820 [32];
  undefined1 local_800 [32];
  undefined1 local_7e0 [16];
  undefined1 local_7d0 [16];
  undefined1 local_7c0 [8];
  float fStack_7b8;
  float fStack_7b4;
  undefined1 local_7a0 [32];
  undefined1 local_780 [32];
  undefined1 local_760 [32];
  undefined1 local_740 [16];
  undefined1 local_730 [16];
  float local_720;
  float fStack_71c;
  float fStack_718;
  float fStack_714;
  undefined1 local_710 [16];
  undefined1 local_700 [16];
  undefined1 local_6f0 [16];
  float local_6e0;
  float fStack_6dc;
  float fStack_6d8;
  float fStack_6d4;
  undefined1 local_6d0 [16];
  undefined1 local_6c0 [8];
  float fStack_6b8;
  float fStack_6b4;
  float fStack_6b0;
  float fStack_6ac;
  float fStack_6a8;
  float fStack_6a4;
  undefined1 local_690 [16];
  undefined1 local_680 [16];
  undefined1 local_670 [16];
  RTCHitN local_660 [16];
  undefined1 auStack_650 [16];
  undefined4 local_640;
  undefined4 uStack_63c;
  undefined4 uStack_638;
  undefined4 uStack_634;
  float local_630;
  float fStack_62c;
  float fStack_628;
  float fStack_624;
  undefined1 local_620 [16];
  undefined8 local_610;
  undefined8 uStack_608;
  undefined1 local_600 [16];
  uint local_5f0;
  uint uStack_5ec;
  uint uStack_5e8;
  uint uStack_5e4;
  uint uStack_5e0;
  uint uStack_5dc;
  uint uStack_5d8;
  uint uStack_5d4;
  undefined1 local_5c0 [8];
  float fStack_5b8;
  float fStack_5b4;
  float fStack_5b0;
  float fStack_5ac;
  float fStack_5a8;
  float fStack_5a4;
  undefined1 local_5a0 [8];
  float fStack_598;
  float fStack_594;
  float fStack_590;
  float fStack_58c;
  float fStack_588;
  float fStack_584;
  float local_580;
  float fStack_57c;
  float fStack_578;
  float fStack_574;
  float fStack_570;
  float fStack_56c;
  float fStack_568;
  float fStack_564;
  undefined1 local_560 [32];
  undefined1 local_540 [32];
  undefined1 local_520 [32];
  undefined1 local_500 [32];
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [32];
  undefined1 local_480 [8];
  float fStack_478;
  float fStack_474;
  float fStack_470;
  float fStack_46c;
  float fStack_468;
  float fStack_464;
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  undefined1 local_400 [32];
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  undefined1 local_380 [32];
  undefined1 local_360 [32];
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  undefined1 local_240 [32];
  float local_220;
  float fStack_21c;
  float fStack_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  float fStack_208;
  float fStack_204;
  undefined1 local_200 [32];
  undefined1 local_1e0 [8];
  float fStack_1d8;
  float fStack_1d4;
  float fStack_1d0;
  float fStack_1cc;
  float fStack_1c8;
  undefined1 local_1c0 [8];
  float fStack_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  float fStack_1a4;
  undefined1 local_1a0 [32];
  byte local_180 [32];
  undefined1 auStack_160 [32];
  float local_140 [2];
  uint local_138 [66];
  undefined1 auVar126 [32];
  undefined1 auVar134 [32];
  undefined1 auVar137 [32];
  undefined1 auVar256 [64];
  undefined1 auVar258 [64];
  
  PVar2 = prim[1];
  uVar80 = (ulong)(byte)PVar2;
  lVar77 = uVar80 * 0x19;
  fVar242 = *(float *)(prim + lVar77 + 0x12);
  auVar84 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x10);
  auVar84 = vinsertps_avx(auVar84,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar85 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar89 = vinsertps_avx(auVar85,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  auVar90 = vsubps_avx(auVar84,*(undefined1 (*) [16])(prim + lVar77 + 6));
  fVar211 = fVar242 * auVar90._0_4_;
  fVar147 = fVar242 * auVar89._0_4_;
  auVar84._8_8_ = 0;
  auVar84._0_8_ = *(ulong *)(prim + uVar80 * 4 + 6);
  auVar97 = vpmovsxbd_avx2(auVar84);
  auVar97 = vcvtdq2ps_avx(auVar97);
  auVar85._8_8_ = 0;
  auVar85._0_8_ = *(ulong *)(prim + uVar80 * 5 + 6);
  auVar96 = vpmovsxbd_avx2(auVar85);
  auVar96 = vcvtdq2ps_avx(auVar96);
  auVar86._8_8_ = 0;
  auVar86._0_8_ = *(ulong *)(prim + uVar80 * 6 + 6);
  auVar98 = vpmovsxbd_avx2(auVar86);
  auVar98 = vcvtdq2ps_avx(auVar98);
  auVar1._8_8_ = 0;
  auVar1._0_8_ = *(ulong *)(prim + uVar80 * 0xb + 6);
  auVar99 = vpmovsxbd_avx2(auVar1);
  auVar99 = vcvtdq2ps_avx(auVar99);
  auVar82._8_8_ = 0;
  auVar82._0_8_ = *(ulong *)(prim + (ulong)((uint)(byte)PVar2 * 0xc) + 6);
  auVar100 = vpmovsxbd_avx2(auVar82);
  auVar100 = vcvtdq2ps_avx(auVar100);
  auVar221._8_8_ = 0;
  auVar221._0_8_ = *(ulong *)(prim + (uint)(byte)PVar2 * 0xc + uVar80 + 6);
  auVar101 = vpmovsxbd_avx2(auVar221);
  auVar101 = vcvtdq2ps_avx(auVar101);
  uVar72 = (ulong)(uint)((int)(uVar80 * 9) * 2);
  auVar87._8_8_ = 0;
  auVar87._0_8_ = *(ulong *)(prim + uVar72 + 6);
  auVar102 = vpmovsxbd_avx2(auVar87);
  auVar83._8_8_ = 0;
  auVar83._0_8_ = *(ulong *)(prim + uVar72 + uVar80 + 6);
  auVar105 = vpmovsxbd_avx2(auVar83);
  auVar102 = vcvtdq2ps_avx(auVar102);
  auVar103 = vcvtdq2ps_avx(auVar105);
  uVar74 = (ulong)(uint)((int)(uVar80 * 5) << 2);
  auVar88._8_8_ = 0;
  auVar88._0_8_ = *(ulong *)(prim + uVar74 + 6);
  auVar94 = vpmovsxbd_avx2(auVar88);
  auVar104 = vcvtdq2ps_avx(auVar94);
  auVar113._4_4_ = fVar147;
  auVar113._0_4_ = fVar147;
  auVar113._8_4_ = fVar147;
  auVar113._12_4_ = fVar147;
  auVar113._16_4_ = fVar147;
  auVar113._20_4_ = fVar147;
  auVar113._24_4_ = fVar147;
  auVar113._28_4_ = fVar147;
  auVar115._8_4_ = 1;
  auVar115._0_8_ = 0x100000001;
  auVar115._12_4_ = 1;
  auVar115._16_4_ = 1;
  auVar115._20_4_ = 1;
  auVar115._24_4_ = 1;
  auVar115._28_4_ = 1;
  auVar106 = ZEXT1632(CONCAT412(fVar242 * auVar89._12_4_,
                                CONCAT48(fVar242 * auVar89._8_4_,
                                         CONCAT44(fVar242 * auVar89._4_4_,fVar147))));
  auVar95 = vpermps_avx2(auVar115,auVar106);
  auVar92 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar93 = vpermps_avx512vl(auVar92,auVar106);
  fVar147 = auVar93._0_4_;
  fVar244 = auVar93._4_4_;
  auVar106._4_4_ = fVar244 * auVar98._4_4_;
  auVar106._0_4_ = fVar147 * auVar98._0_4_;
  fVar245 = auVar93._8_4_;
  auVar106._8_4_ = fVar245 * auVar98._8_4_;
  fVar246 = auVar93._12_4_;
  auVar106._12_4_ = fVar246 * auVar98._12_4_;
  fVar237 = auVar93._16_4_;
  auVar106._16_4_ = fVar237 * auVar98._16_4_;
  fVar238 = auVar93._20_4_;
  auVar106._20_4_ = fVar238 * auVar98._20_4_;
  fVar247 = auVar93._24_4_;
  auVar106._24_4_ = fVar247 * auVar98._24_4_;
  auVar106._28_4_ = auVar105._28_4_;
  auVar105._4_4_ = auVar101._4_4_ * fVar244;
  auVar105._0_4_ = auVar101._0_4_ * fVar147;
  auVar105._8_4_ = auVar101._8_4_ * fVar245;
  auVar105._12_4_ = auVar101._12_4_ * fVar246;
  auVar105._16_4_ = auVar101._16_4_ * fVar237;
  auVar105._20_4_ = auVar101._20_4_ * fVar238;
  auVar105._24_4_ = auVar101._24_4_ * fVar247;
  auVar105._28_4_ = auVar94._28_4_;
  auVar94._4_4_ = auVar104._4_4_ * fVar244;
  auVar94._0_4_ = auVar104._0_4_ * fVar147;
  auVar94._8_4_ = auVar104._8_4_ * fVar245;
  auVar94._12_4_ = auVar104._12_4_ * fVar246;
  auVar94._16_4_ = auVar104._16_4_ * fVar237;
  auVar94._20_4_ = auVar104._20_4_ * fVar238;
  auVar94._24_4_ = auVar104._24_4_ * fVar247;
  auVar94._28_4_ = auVar93._28_4_;
  auVar84 = vfmadd231ps_fma(auVar106,auVar95,auVar96);
  auVar85 = vfmadd231ps_fma(auVar105,auVar95,auVar100);
  auVar86 = vfmadd231ps_fma(auVar94,auVar103,auVar95);
  auVar84 = vfmadd231ps_fma(ZEXT1632(auVar84),auVar113,auVar97);
  auVar85 = vfmadd231ps_fma(ZEXT1632(auVar85),auVar113,auVar99);
  auVar86 = vfmadd231ps_fma(ZEXT1632(auVar86),auVar102,auVar113);
  auVar114._4_4_ = fVar211;
  auVar114._0_4_ = fVar211;
  auVar114._8_4_ = fVar211;
  auVar114._12_4_ = fVar211;
  auVar114._16_4_ = fVar211;
  auVar114._20_4_ = fVar211;
  auVar114._24_4_ = fVar211;
  auVar114._28_4_ = fVar211;
  auVar94 = ZEXT1632(CONCAT412(fVar242 * auVar90._12_4_,
                               CONCAT48(fVar242 * auVar90._8_4_,
                                        CONCAT44(fVar242 * auVar90._4_4_,fVar211))));
  auVar105 = vpermps_avx2(auVar115,auVar94);
  auVar94 = vpermps_avx512vl(auVar92,auVar94);
  auVar95 = vmulps_avx512vl(auVar94,auVar98);
  auVar108._0_4_ = auVar94._0_4_ * auVar101._0_4_;
  auVar108._4_4_ = auVar94._4_4_ * auVar101._4_4_;
  auVar108._8_4_ = auVar94._8_4_ * auVar101._8_4_;
  auVar108._12_4_ = auVar94._12_4_ * auVar101._12_4_;
  auVar108._16_4_ = auVar94._16_4_ * auVar101._16_4_;
  auVar108._20_4_ = auVar94._20_4_ * auVar101._20_4_;
  auVar108._24_4_ = auVar94._24_4_ * auVar101._24_4_;
  auVar108._28_4_ = 0;
  auVar101._4_4_ = auVar94._4_4_ * auVar104._4_4_;
  auVar101._0_4_ = auVar94._0_4_ * auVar104._0_4_;
  auVar101._8_4_ = auVar94._8_4_ * auVar104._8_4_;
  auVar101._12_4_ = auVar94._12_4_ * auVar104._12_4_;
  auVar101._16_4_ = auVar94._16_4_ * auVar104._16_4_;
  auVar101._20_4_ = auVar94._20_4_ * auVar104._20_4_;
  auVar101._24_4_ = auVar94._24_4_ * auVar104._24_4_;
  auVar101._28_4_ = auVar98._28_4_;
  auVar96 = vfmadd231ps_avx512vl(auVar95,auVar105,auVar96);
  auVar1 = vfmadd231ps_fma(auVar108,auVar105,auVar100);
  auVar82 = vfmadd231ps_fma(auVar101,auVar105,auVar103);
  auVar96 = vfmadd231ps_avx512vl(auVar96,auVar114,auVar97);
  auVar1 = vfmadd231ps_fma(ZEXT1632(auVar1),auVar114,auVar99);
  auVar82 = vfmadd231ps_fma(ZEXT1632(auVar82),auVar114,auVar102);
  auVar97 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
  auVar260 = ZEXT3264(auVar97);
  vandps_avx512vl(ZEXT1632(auVar84),auVar97);
  auVar110._8_4_ = 0x219392ef;
  auVar110._0_8_ = 0x219392ef219392ef;
  auVar110._12_4_ = 0x219392ef;
  auVar110._16_4_ = 0x219392ef;
  auVar110._20_4_ = 0x219392ef;
  auVar110._24_4_ = 0x219392ef;
  auVar110._28_4_ = 0x219392ef;
  uVar72 = vcmpps_avx512vl(auVar97,auVar110,1);
  bVar79 = (bool)((byte)uVar72 & 1);
  auVar95._0_4_ = (uint)bVar79 * 0x219392ef | (uint)!bVar79 * auVar84._0_4_;
  bVar79 = (bool)((byte)(uVar72 >> 1) & 1);
  auVar95._4_4_ = (uint)bVar79 * 0x219392ef | (uint)!bVar79 * auVar84._4_4_;
  bVar79 = (bool)((byte)(uVar72 >> 2) & 1);
  auVar95._8_4_ = (uint)bVar79 * 0x219392ef | (uint)!bVar79 * auVar84._8_4_;
  bVar79 = (bool)((byte)(uVar72 >> 3) & 1);
  auVar95._12_4_ = (uint)bVar79 * 0x219392ef | (uint)!bVar79 * auVar84._12_4_;
  auVar95._16_4_ = (uint)((byte)(uVar72 >> 4) & 1) * 0x219392ef;
  auVar95._20_4_ = (uint)((byte)(uVar72 >> 5) & 1) * 0x219392ef;
  auVar95._24_4_ = (uint)((byte)(uVar72 >> 6) & 1) * 0x219392ef;
  auVar95._28_4_ = (uint)(byte)(uVar72 >> 7) * 0x219392ef;
  vandps_avx512vl(ZEXT1632(auVar85),auVar97);
  uVar72 = vcmpps_avx512vl(auVar95,auVar110,1);
  bVar79 = (bool)((byte)uVar72 & 1);
  auVar92._0_4_ = (uint)bVar79 * 0x219392ef | (uint)!bVar79 * auVar85._0_4_;
  bVar79 = (bool)((byte)(uVar72 >> 1) & 1);
  auVar92._4_4_ = (uint)bVar79 * 0x219392ef | (uint)!bVar79 * auVar85._4_4_;
  bVar79 = (bool)((byte)(uVar72 >> 2) & 1);
  auVar92._8_4_ = (uint)bVar79 * 0x219392ef | (uint)!bVar79 * auVar85._8_4_;
  bVar79 = (bool)((byte)(uVar72 >> 3) & 1);
  auVar92._12_4_ = (uint)bVar79 * 0x219392ef | (uint)!bVar79 * auVar85._12_4_;
  auVar92._16_4_ = (uint)((byte)(uVar72 >> 4) & 1) * 0x219392ef;
  auVar92._20_4_ = (uint)((byte)(uVar72 >> 5) & 1) * 0x219392ef;
  auVar92._24_4_ = (uint)((byte)(uVar72 >> 6) & 1) * 0x219392ef;
  auVar92._28_4_ = (uint)(byte)(uVar72 >> 7) * 0x219392ef;
  vandps_avx512vl(ZEXT1632(auVar86),auVar97);
  uVar72 = vcmpps_avx512vl(auVar92,auVar110,1);
  bVar79 = (bool)((byte)uVar72 & 1);
  auVar97._0_4_ = (uint)bVar79 * 0x219392ef | (uint)!bVar79 * auVar86._0_4_;
  bVar79 = (bool)((byte)(uVar72 >> 1) & 1);
  auVar97._4_4_ = (uint)bVar79 * 0x219392ef | (uint)!bVar79 * auVar86._4_4_;
  bVar79 = (bool)((byte)(uVar72 >> 2) & 1);
  auVar97._8_4_ = (uint)bVar79 * 0x219392ef | (uint)!bVar79 * auVar86._8_4_;
  bVar79 = (bool)((byte)(uVar72 >> 3) & 1);
  auVar97._12_4_ = (uint)bVar79 * 0x219392ef | (uint)!bVar79 * auVar86._12_4_;
  auVar97._16_4_ = (uint)((byte)(uVar72 >> 4) & 1) * 0x219392ef;
  auVar97._20_4_ = (uint)((byte)(uVar72 >> 5) & 1) * 0x219392ef;
  auVar97._24_4_ = (uint)((byte)(uVar72 >> 6) & 1) * 0x219392ef;
  auVar97._28_4_ = (uint)(byte)(uVar72 >> 7) * 0x219392ef;
  auVar98 = vrcp14ps_avx512vl(auVar95);
  auVar112._8_4_ = 0x3f800000;
  auVar112._0_8_ = &DAT_3f8000003f800000;
  auVar112._12_4_ = 0x3f800000;
  auVar112._16_4_ = 0x3f800000;
  auVar112._20_4_ = 0x3f800000;
  auVar112._24_4_ = 0x3f800000;
  auVar112._28_4_ = 0x3f800000;
  auVar84 = vfnmadd213ps_fma(auVar95,auVar98,auVar112);
  auVar84 = vfmadd132ps_fma(ZEXT1632(auVar84),auVar98,auVar98);
  auVar98 = vrcp14ps_avx512vl(auVar92);
  auVar85 = vfnmadd213ps_fma(auVar92,auVar98,auVar112);
  auVar85 = vfmadd132ps_fma(ZEXT1632(auVar85),auVar98,auVar98);
  auVar98 = vrcp14ps_avx512vl(auVar97);
  auVar86 = vfnmadd213ps_fma(auVar97,auVar98,auVar112);
  auVar86 = vfmadd132ps_fma(ZEXT1632(auVar86),auVar98,auVar98);
  auVar97 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar80 * 7 + 6));
  auVar97 = vcvtdq2ps_avx(auVar97);
  auVar98 = vsubps_avx512vl(auVar97,auVar96);
  auVar97 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar80 * 9 + 6));
  auVar102._4_4_ = auVar84._4_4_ * auVar98._4_4_;
  auVar102._0_4_ = auVar84._0_4_ * auVar98._0_4_;
  auVar102._8_4_ = auVar84._8_4_ * auVar98._8_4_;
  auVar102._12_4_ = auVar84._12_4_ * auVar98._12_4_;
  auVar102._16_4_ = auVar98._16_4_ * 0.0;
  auVar102._20_4_ = auVar98._20_4_ * 0.0;
  auVar102._24_4_ = auVar98._24_4_ * 0.0;
  auVar102._28_4_ = auVar98._28_4_;
  auVar97 = vcvtdq2ps_avx(auVar97);
  auVar97 = vsubps_avx512vl(auVar97,auVar96);
  auVar109._0_4_ = auVar84._0_4_ * auVar97._0_4_;
  auVar109._4_4_ = auVar84._4_4_ * auVar97._4_4_;
  auVar109._8_4_ = auVar84._8_4_ * auVar97._8_4_;
  auVar109._12_4_ = auVar84._12_4_ * auVar97._12_4_;
  auVar109._16_4_ = auVar97._16_4_ * 0.0;
  auVar109._20_4_ = auVar97._20_4_ * 0.0;
  auVar109._24_4_ = auVar97._24_4_ * 0.0;
  auVar109._28_4_ = 0;
  auVar96 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + (ulong)(byte)PVar2 * 0x10 + 6));
  auVar97 = vpmovsxwd_avx2(*(undefined1 (*) [16])
                            (prim + (ulong)(byte)PVar2 * 0x10 + uVar80 * -2 + 6));
  auVar97 = vcvtdq2ps_avx(auVar97);
  auVar97 = vsubps_avx(auVar97,ZEXT1632(auVar1));
  auVar103._4_4_ = auVar85._4_4_ * auVar97._4_4_;
  auVar103._0_4_ = auVar85._0_4_ * auVar97._0_4_;
  auVar103._8_4_ = auVar85._8_4_ * auVar97._8_4_;
  auVar103._12_4_ = auVar85._12_4_ * auVar97._12_4_;
  auVar103._16_4_ = auVar97._16_4_ * 0.0;
  auVar103._20_4_ = auVar97._20_4_ * 0.0;
  auVar103._24_4_ = auVar97._24_4_ * 0.0;
  auVar103._28_4_ = auVar97._28_4_;
  auVar97 = vcvtdq2ps_avx(auVar96);
  auVar97 = vsubps_avx(auVar97,ZEXT1632(auVar1));
  auVar107._0_4_ = auVar85._0_4_ * auVar97._0_4_;
  auVar107._4_4_ = auVar85._4_4_ * auVar97._4_4_;
  auVar107._8_4_ = auVar85._8_4_ * auVar97._8_4_;
  auVar107._12_4_ = auVar85._12_4_ * auVar97._12_4_;
  auVar107._16_4_ = auVar97._16_4_ * 0.0;
  auVar107._20_4_ = auVar97._20_4_ * 0.0;
  auVar107._24_4_ = auVar97._24_4_ * 0.0;
  auVar107._28_4_ = 0;
  auVar97 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar74 + uVar80 + 6));
  auVar97 = vcvtdq2ps_avx(auVar97);
  auVar97 = vsubps_avx(auVar97,ZEXT1632(auVar82));
  auVar104._4_4_ = auVar97._4_4_ * auVar86._4_4_;
  auVar104._0_4_ = auVar97._0_4_ * auVar86._0_4_;
  auVar104._8_4_ = auVar97._8_4_ * auVar86._8_4_;
  auVar104._12_4_ = auVar97._12_4_ * auVar86._12_4_;
  auVar104._16_4_ = auVar97._16_4_ * 0.0;
  auVar104._20_4_ = auVar97._20_4_ * 0.0;
  auVar104._24_4_ = auVar97._24_4_ * 0.0;
  auVar104._28_4_ = auVar97._28_4_;
  auVar97 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar80 * 0x17 + 6));
  auVar97 = vcvtdq2ps_avx(auVar97);
  auVar97 = vsubps_avx(auVar97,ZEXT1632(auVar82));
  auVar93._0_4_ = auVar86._0_4_ * auVar97._0_4_;
  auVar93._4_4_ = auVar86._4_4_ * auVar97._4_4_;
  auVar93._8_4_ = auVar86._8_4_ * auVar97._8_4_;
  auVar93._12_4_ = auVar86._12_4_ * auVar97._12_4_;
  auVar93._16_4_ = auVar97._16_4_ * 0.0;
  auVar93._20_4_ = auVar97._20_4_ * 0.0;
  auVar93._24_4_ = auVar97._24_4_ * 0.0;
  auVar93._28_4_ = 0;
  auVar97 = vpminsd_avx2(auVar102,auVar109);
  auVar96 = vpminsd_avx2(auVar103,auVar107);
  auVar97 = vmaxps_avx(auVar97,auVar96);
  auVar96 = vpminsd_avx2(auVar104,auVar93);
  uVar148 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar98._4_4_ = uVar148;
  auVar98._0_4_ = uVar148;
  auVar98._8_4_ = uVar148;
  auVar98._12_4_ = uVar148;
  auVar98._16_4_ = uVar148;
  auVar98._20_4_ = uVar148;
  auVar98._24_4_ = uVar148;
  auVar98._28_4_ = uVar148;
  auVar96 = vmaxps_avx512vl(auVar96,auVar98);
  auVar97 = vmaxps_avx(auVar97,auVar96);
  auVar96._8_4_ = 0x3f7ffffa;
  auVar96._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar96._12_4_ = 0x3f7ffffa;
  auVar96._16_4_ = 0x3f7ffffa;
  auVar96._20_4_ = 0x3f7ffffa;
  auVar96._24_4_ = 0x3f7ffffa;
  auVar96._28_4_ = 0x3f7ffffa;
  local_420 = vmulps_avx512vl(auVar97,auVar96);
  auVar97 = vpmaxsd_avx2(auVar102,auVar109);
  auVar96 = vpmaxsd_avx2(auVar103,auVar107);
  auVar97 = vminps_avx(auVar97,auVar96);
  auVar96 = vpmaxsd_avx2(auVar104,auVar93);
  uVar148 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar99._4_4_ = uVar148;
  auVar99._0_4_ = uVar148;
  auVar99._8_4_ = uVar148;
  auVar99._12_4_ = uVar148;
  auVar99._16_4_ = uVar148;
  auVar99._20_4_ = uVar148;
  auVar99._24_4_ = uVar148;
  auVar99._28_4_ = uVar148;
  auVar96 = vminps_avx512vl(auVar96,auVar99);
  auVar97 = vminps_avx(auVar97,auVar96);
  auVar100._8_4_ = 0x3f800003;
  auVar100._0_8_ = 0x3f8000033f800003;
  auVar100._12_4_ = 0x3f800003;
  auVar100._16_4_ = 0x3f800003;
  auVar100._20_4_ = 0x3f800003;
  auVar100._24_4_ = 0x3f800003;
  auVar100._28_4_ = 0x3f800003;
  auVar97 = vmulps_avx512vl(auVar97,auVar100);
  auVar96 = vpbroadcastd_avx512vl();
  uVar13 = vpcmpgtd_avx512vl(auVar96,_DAT_0205a920);
  uVar12 = vcmpps_avx512vl(local_420,auVar97,2);
  bVar78 = (byte)((byte)uVar12 & (byte)uVar13) == 0;
  bVar79 = !bVar78;
  if (bVar78) {
    return bVar79;
  }
  local_860 = (ulong)(byte)((byte)uVar12 & (byte)uVar13);
  pPVar75 = prim + lVar77 + 0x16;
  local_690 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
  local_878 = pPVar75;
  local_870 = prim;
LAB_01d3ff40:
  iVar15 = 0;
  for (uVar72 = local_860; (uVar72 & 1) == 0; uVar72 = uVar72 >> 1 | 0x8000000000000000) {
    iVar15 = iVar15 + 1;
  }
  local_860 = local_860 - 1 & local_860;
  uVar72 = (ulong)(uint)(iVar15 << 6);
  auVar84 = *(undefined1 (*) [16])(pPVar75 + uVar72);
  if (local_860 != 0) {
    uVar74 = local_860 - 1 & local_860;
    for (uVar80 = local_860; (uVar80 & 1) == 0; uVar80 = uVar80 >> 1 | 0x8000000000000000) {
    }
    if (uVar74 != 0) {
      for (; (uVar74 & 1) == 0; uVar74 = uVar74 >> 1 | 0x8000000000000000) {
      }
    }
  }
  auVar85 = *(undefined1 (*) [16])(pPVar75 + uVar72 + 0x10);
  auVar86 = *(undefined1 (*) [16])(pPVar75 + uVar72 + 0x20);
  auVar1 = *(undefined1 (*) [16])(pPVar75 + uVar72 + 0x30);
  auVar82 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x1c);
  auVar221 = vinsertps_avx(auVar82,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
  local_858 = (ulong)*(uint *)(prim + 2);
  uVar148 = *(undefined4 *)(ray + k * 4 + 0x40);
  auVar253._4_4_ = uVar148;
  auVar253._0_4_ = uVar148;
  auVar253._8_4_ = uVar148;
  auVar253._12_4_ = uVar148;
  local_4a0._16_4_ = uVar148;
  local_4a0._0_16_ = auVar253;
  local_4a0._20_4_ = uVar148;
  local_4a0._24_4_ = uVar148;
  local_4a0._28_4_ = uVar148;
  auVar256 = ZEXT3264(local_4a0);
  uVar148 = *(undefined4 *)(ray + k * 4 + 0x50);
  auVar257._4_4_ = uVar148;
  auVar257._0_4_ = uVar148;
  auVar257._8_4_ = uVar148;
  auVar257._12_4_ = uVar148;
  local_4c0._16_4_ = uVar148;
  local_4c0._0_16_ = auVar257;
  local_4c0._20_4_ = uVar148;
  local_4c0._24_4_ = uVar148;
  local_4c0._28_4_ = uVar148;
  auVar258 = ZEXT3264(local_4c0);
  auVar82 = vunpcklps_avx(auVar253,auVar257);
  fVar242 = *(float *)(ray + k * 4 + 0x60);
  auVar259._4_4_ = fVar242;
  auVar259._0_4_ = fVar242;
  auVar259._8_4_ = fVar242;
  auVar259._12_4_ = fVar242;
  local_4e0._16_4_ = fVar242;
  local_4e0._0_16_ = auVar259;
  local_4e0._20_4_ = fVar242;
  local_4e0._24_4_ = fVar242;
  local_4e0._28_4_ = fVar242;
  local_7d0 = vinsertps_avx(auVar82,auVar259,0x28);
  auVar243 = ZEXT1664(local_7d0);
  auVar90._0_4_ = auVar84._0_4_ + auVar85._0_4_ + auVar86._0_4_ + auVar1._0_4_;
  auVar90._4_4_ = auVar84._4_4_ + auVar85._4_4_ + auVar86._4_4_ + auVar1._4_4_;
  auVar90._8_4_ = auVar84._8_4_ + auVar85._8_4_ + auVar86._8_4_ + auVar1._8_4_;
  auVar90._12_4_ = auVar84._12_4_ + auVar85._12_4_ + auVar86._12_4_ + auVar1._12_4_;
  auVar89._8_4_ = 0x3e800000;
  auVar89._0_8_ = 0x3e8000003e800000;
  auVar89._12_4_ = 0x3e800000;
  auVar82 = vmulps_avx512vl(auVar90,auVar89);
  auVar82 = vsubps_avx(auVar82,auVar221);
  auVar82 = vdpps_avx(auVar82,local_7d0,0x7f);
  fVar147 = *(float *)(ray + k * 4 + 0x30);
  auVar249 = ZEXT464((uint)fVar147);
  local_7e0 = vdpps_avx(local_7d0,local_7d0,0x7f);
  auVar251 = ZEXT1664(local_7e0);
  auVar235._4_12_ = ZEXT812(0) << 0x20;
  auVar235._0_4_ = local_7e0._0_4_;
  auVar83 = vrcp14ss_avx512f(ZEXT816(0) << 0x40,auVar235);
  auVar87 = vfnmadd213ss_fma(auVar83,local_7e0,ZEXT416(0x40000000));
  local_220 = auVar82._0_4_ * auVar83._0_4_ * auVar87._0_4_;
  auVar233 = ZEXT464((uint)local_220);
  auVar236._4_4_ = local_220;
  auVar236._0_4_ = local_220;
  auVar236._8_4_ = local_220;
  auVar236._12_4_ = local_220;
  fStack_5b0 = local_220;
  _local_5c0 = auVar236;
  fStack_5ac = local_220;
  fStack_5a8 = local_220;
  fStack_5a4 = local_220;
  auVar82 = vfmadd231ps_fma(auVar221,local_7d0,auVar236);
  auVar82 = vblendps_avx(auVar82,ZEXT816(0) << 0x40,8);
  auVar84 = vsubps_avx(auVar84,auVar82);
  auVar86 = vsubps_avx(auVar86,auVar82);
  auVar85 = vsubps_avx(auVar85,auVar82);
  auVar241 = ZEXT1664(auVar85);
  auVar1 = vsubps_avx(auVar1,auVar82);
  local_240 = vbroadcastss_avx512vl(auVar84);
  auVar116._8_4_ = 1;
  auVar116._0_8_ = 0x100000001;
  auVar116._12_4_ = 1;
  auVar116._16_4_ = 1;
  auVar116._20_4_ = 1;
  auVar116._24_4_ = 1;
  auVar116._28_4_ = 1;
  local_760 = ZEXT1632(auVar84);
  local_260 = vpermps_avx512vl(auVar116,local_760);
  auVar117._8_4_ = 2;
  auVar117._0_8_ = 0x200000002;
  auVar117._12_4_ = 2;
  auVar117._16_4_ = 2;
  auVar117._20_4_ = 2;
  auVar117._24_4_ = 2;
  auVar117._28_4_ = 2;
  local_280 = vpermps_avx512vl(auVar117,local_760);
  auVar118._8_4_ = 3;
  auVar118._0_8_ = 0x300000003;
  auVar118._12_4_ = 3;
  auVar118._16_4_ = 3;
  auVar118._20_4_ = 3;
  auVar118._24_4_ = 3;
  auVar118._28_4_ = 3;
  local_2a0 = vpermps_avx512vl(auVar118,local_760);
  local_2c0 = vbroadcastss_avx512vl(auVar85);
  local_7a0 = ZEXT1632(auVar85);
  local_2e0 = vpermps_avx512vl(auVar116,local_7a0);
  local_300 = vpermps_avx512vl(auVar117,local_7a0);
  local_320 = vpermps_avx512vl(auVar118,local_7a0);
  local_340 = vbroadcastss_avx512vl(auVar86);
  local_780 = ZEXT1632(auVar86);
  local_360 = vpermps_avx512vl(auVar116,local_780);
  local_380 = vpermps_avx512vl(auVar117,local_780);
  local_3a0 = vpermps_avx512vl(auVar118,local_780);
  local_3c0 = vbroadcastss_avx512vl(auVar1);
  _local_7c0 = ZEXT1632(auVar1);
  _local_1e0 = vpermps_avx2(auVar116,_local_7c0);
  local_500 = vpermps_avx512vl(auVar117,_local_7c0);
  local_400 = vpermps_avx2(auVar118,_local_7c0);
  auVar84 = vfmadd231ps_fma(ZEXT432((uint)(fVar242 * fVar242)),local_4c0,local_4c0);
  auVar84 = vfmadd231ps_fma(ZEXT1632(auVar84),local_4a0,local_4a0);
  uVar148 = auVar84._0_4_;
  local_200._4_4_ = uVar148;
  local_200._0_4_ = uVar148;
  local_200._8_4_ = uVar148;
  local_200._12_4_ = uVar148;
  local_200._16_4_ = uVar148;
  local_200._20_4_ = uVar148;
  local_200._24_4_ = uVar148;
  local_200._28_4_ = uVar148;
  vandps_avx512vl(local_200,auVar260._0_32_);
  local_730 = ZEXT416((uint)local_220);
  local_220 = fVar147 - local_220;
  fStack_21c = local_220;
  fStack_218 = local_220;
  fStack_214 = local_220;
  fStack_210 = local_220;
  fStack_20c = local_220;
  fStack_208 = local_220;
  fStack_204 = local_220;
  local_670 = vpbroadcastd_avx512vl();
  local_868 = 1;
  bVar73 = 0;
  local_680 = vpbroadcastd_avx512vl();
  auVar84 = vsqrtss_avx(local_7e0,local_7e0);
  local_8c4 = auVar84._0_4_;
  auVar84 = vsqrtss_avx(local_7e0,local_7e0);
  local_8c8 = auVar84._0_4_;
  auVar207 = ZEXT1664(ZEXT816(0x3f80000000000000));
  auVar220 = ZEXT3264(CONCAT428(0x3f800000,
                                CONCAT424(0x3f800000,
                                          CONCAT420(0x3f800000,
                                                    CONCAT416(0x3f800000,
                                                              CONCAT412(0x3f800000,
                                                                        CONCAT48(0x3f800000,
                                                                                 &
                                                  DAT_3f8000003f800000)))))));
  local_3e0 = local_500;
  uVar72 = 0;
  do {
    local_890 = auVar207._0_16_;
    auVar84 = vmovshdup_avx(local_890);
    fVar242 = auVar207._0_4_;
    fVar192 = auVar84._0_4_ - fVar242;
    fVar239 = fVar192 * 0.04761905;
    auVar226._4_4_ = fVar242;
    auVar226._0_4_ = fVar242;
    auVar226._8_4_ = fVar242;
    auVar226._12_4_ = fVar242;
    auVar226._16_4_ = fVar242;
    auVar226._20_4_ = fVar242;
    auVar226._24_4_ = fVar242;
    auVar226._28_4_ = fVar242;
    local_800._4_4_ = fVar192;
    local_800._0_4_ = fVar192;
    local_800._8_4_ = fVar192;
    local_800._12_4_ = fVar192;
    local_800._16_4_ = fVar192;
    local_800._20_4_ = fVar192;
    local_800._24_4_ = fVar192;
    local_800._28_4_ = fVar192;
    auVar84 = vfmadd231ps_fma(auVar226,local_800,_DAT_02020f20);
    auVar97 = vsubps_avx(auVar220._0_32_,ZEXT1632(auVar84));
    fVar242 = auVar97._0_4_;
    fVar245 = auVar97._4_4_;
    fVar237 = auVar97._8_4_;
    fVar247 = auVar97._12_4_;
    fVar231 = auVar97._16_4_;
    fVar232 = auVar97._20_4_;
    fVar248 = auVar97._24_4_;
    fVar149 = fVar242 * fVar242 * fVar242;
    fVar167 = fVar245 * fVar245 * fVar245;
    auVar29._4_4_ = fVar167;
    auVar29._0_4_ = fVar149;
    fVar168 = fVar237 * fVar237 * fVar237;
    auVar29._8_4_ = fVar168;
    fVar169 = fVar247 * fVar247 * fVar247;
    auVar29._12_4_ = fVar169;
    fVar170 = fVar231 * fVar231 * fVar231;
    auVar29._16_4_ = fVar170;
    fVar171 = fVar232 * fVar232 * fVar232;
    auVar29._20_4_ = fVar171;
    fVar172 = fVar248 * fVar248 * fVar248;
    auVar29._24_4_ = fVar172;
    auVar29._28_4_ = fVar192;
    auVar96 = vbroadcastss_avx512vl(ZEXT416(0x40800000));
    auVar98 = vmulps_avx512vl(auVar29,auVar96);
    fVar244 = auVar84._0_4_;
    fVar246 = auVar84._4_4_;
    fVar238 = auVar84._8_4_;
    fVar211 = auVar84._12_4_;
    fVar191 = fVar244 * fVar244 * fVar244;
    fVar208 = fVar246 * fVar246 * fVar246;
    fVar209 = fVar238 * fVar238 * fVar238;
    fVar210 = fVar211 * fVar211 * fVar211;
    auVar260._28_36_ = auVar207._28_36_;
    auVar260._0_28_ = ZEXT1628(CONCAT412(fVar210,CONCAT48(fVar209,CONCAT44(fVar208,fVar191))));
    auVar220._0_4_ = fVar244 * fVar242;
    auVar220._4_4_ = fVar246 * fVar245;
    auVar220._8_4_ = fVar238 * fVar237;
    auVar220._12_4_ = fVar211 * fVar247;
    auVar220._16_4_ = fVar231 * 0.0;
    auVar220._20_4_ = fVar232 * 0.0;
    auVar220._28_36_ = auVar249._28_36_;
    auVar220._24_4_ = fVar248 * 0.0;
    auVar99 = vmulps_avx512vl(auVar260._0_32_,auVar96);
    fVar252 = auVar99._28_4_ + fVar192;
    fVar30 = auVar256._28_4_;
    fVar234 = fVar252 + fVar30 + auVar233._28_4_;
    auVar31._4_4_ = fVar167 * 0.16666667;
    auVar31._0_4_ = fVar149 * 0.16666667;
    auVar31._8_4_ = fVar168 * 0.16666667;
    auVar31._12_4_ = fVar169 * 0.16666667;
    auVar31._16_4_ = fVar170 * 0.16666667;
    auVar31._20_4_ = fVar171 * 0.16666667;
    auVar31._24_4_ = fVar172 * 0.16666667;
    auVar31._28_4_ = fVar252;
    auVar32._4_4_ =
         (auVar220._4_4_ * fVar245 * 12.0 + auVar220._4_4_ * fVar246 * 6.0 + fVar208 + auVar98._4_4_
         ) * 0.16666667;
    auVar32._0_4_ =
         (auVar220._0_4_ * fVar242 * 12.0 + auVar220._0_4_ * fVar244 * 6.0 + fVar191 + auVar98._0_4_
         ) * 0.16666667;
    auVar32._8_4_ =
         (auVar220._8_4_ * fVar237 * 12.0 + auVar220._8_4_ * fVar238 * 6.0 + fVar209 + auVar98._8_4_
         ) * 0.16666667;
    auVar32._12_4_ =
         (auVar220._12_4_ * fVar247 * 12.0 + auVar220._12_4_ * fVar211 * 6.0 +
         fVar210 + auVar98._12_4_) * 0.16666667;
    auVar32._16_4_ =
         (auVar220._16_4_ * fVar231 * 12.0 + auVar220._16_4_ * 0.0 * 6.0 + auVar98._16_4_ + 0.0) *
         0.16666667;
    auVar32._20_4_ =
         (auVar220._20_4_ * fVar232 * 12.0 + auVar220._20_4_ * 0.0 * 6.0 + auVar98._20_4_ + 0.0) *
         0.16666667;
    auVar32._24_4_ =
         (auVar220._24_4_ * fVar248 * 12.0 + auVar220._24_4_ * 0.0 * 6.0 + auVar98._24_4_ + 0.0) *
         0.16666667;
    auVar32._28_4_ = fVar30;
    auVar33._4_4_ =
         (auVar99._4_4_ + fVar167 + auVar220._4_4_ * fVar246 * 12.0 + auVar220._4_4_ * fVar245 * 6.0
         ) * 0.16666667;
    auVar33._0_4_ =
         (auVar99._0_4_ + fVar149 + auVar220._0_4_ * fVar244 * 12.0 + auVar220._0_4_ * fVar242 * 6.0
         ) * 0.16666667;
    auVar33._8_4_ =
         (auVar99._8_4_ + fVar168 + auVar220._8_4_ * fVar238 * 12.0 + auVar220._8_4_ * fVar237 * 6.0
         ) * 0.16666667;
    auVar33._12_4_ =
         (auVar99._12_4_ + fVar169 +
         auVar220._12_4_ * fVar211 * 12.0 + auVar220._12_4_ * fVar247 * 6.0) * 0.16666667;
    auVar33._16_4_ =
         (auVar99._16_4_ + fVar170 + auVar220._16_4_ * 0.0 * 12.0 + auVar220._16_4_ * fVar231 * 6.0)
         * 0.16666667;
    auVar33._20_4_ =
         (auVar99._20_4_ + fVar171 + auVar220._20_4_ * 0.0 * 12.0 + auVar220._20_4_ * fVar232 * 6.0)
         * 0.16666667;
    auVar33._24_4_ =
         (auVar99._24_4_ + fVar172 + auVar220._24_4_ * 0.0 * 12.0 + auVar220._24_4_ * fVar248 * 6.0)
         * 0.16666667;
    auVar33._28_4_ = auVar258._28_4_;
    fVar191 = fVar191 * 0.16666667;
    fVar208 = fVar208 * 0.16666667;
    fVar209 = fVar209 * 0.16666667;
    fVar210 = fVar210 * 0.16666667;
    auVar34._28_4_ = fVar234;
    auVar34._0_28_ = ZEXT1628(CONCAT412(fVar210,CONCAT48(fVar209,CONCAT44(fVar208,fVar191))));
    auVar99 = vmulps_avx512vl(local_3c0,auVar34);
    auVar35._4_4_ = (float)local_1e0._4_4_ * fVar208;
    auVar35._0_4_ = (float)local_1e0._0_4_ * fVar191;
    auVar35._8_4_ = fStack_1d8 * fVar209;
    auVar35._12_4_ = fStack_1d4 * fVar210;
    auVar35._16_4_ = fStack_1d0 * 0.0;
    auVar35._20_4_ = fStack_1cc * 0.0;
    auVar35._24_4_ = fStack_1c8 * 0.0;
    auVar35._28_4_ = auVar251._28_4_ + auVar258._28_4_ + auVar207._28_4_ + auVar98._28_4_;
    auVar98 = vmulps_avx512vl(local_3e0,auVar34);
    auVar36._4_4_ = local_400._4_4_ * fVar208;
    auVar36._0_4_ = local_400._0_4_ * fVar191;
    auVar36._8_4_ = local_400._8_4_ * fVar209;
    auVar36._12_4_ = local_400._12_4_ * fVar210;
    auVar36._16_4_ = local_400._16_4_ * 0.0;
    auVar36._20_4_ = local_400._20_4_ * 0.0;
    auVar36._24_4_ = local_400._24_4_ * 0.0;
    auVar36._28_4_ = fVar234;
    auVar99 = vfmadd231ps_avx512vl(auVar99,auVar33,local_340);
    auVar100 = vfmadd231ps_avx512vl(auVar35,auVar33,local_360);
    auVar98 = vfmadd231ps_avx512vl(auVar98,auVar33,local_380);
    auVar101 = vfmadd231ps_avx512vl(auVar36,local_3a0,auVar33);
    auVar99 = vfmadd231ps_avx512vl(auVar99,auVar32,local_2c0);
    auVar100 = vfmadd231ps_avx512vl(auVar100,auVar32,local_2e0);
    auVar98 = vfmadd231ps_avx512vl(auVar98,auVar32,local_300);
    auVar101 = vfmadd231ps_avx512vl(auVar101,local_320,auVar32);
    auVar102 = vfmadd231ps_avx512vl(auVar99,auVar31,local_240);
    auVar103 = vfmadd231ps_avx512vl(auVar100,auVar31,local_260);
    auVar104 = vfmadd231ps_avx512vl(auVar98,auVar31,local_280);
    auVar98 = vfmadd231ps_avx512vl(auVar101,local_2a0,auVar31);
    auVar99 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
    auVar100 = vxorps_avx512vl(auVar97,auVar99);
    auVar99 = vxorps_avx512vl(ZEXT1632(auVar84),auVar99);
    auVar227._0_4_ = auVar99._0_4_ * fVar244;
    auVar227._4_4_ = auVar99._4_4_ * fVar246;
    auVar227._8_4_ = auVar99._8_4_ * fVar238;
    auVar227._12_4_ = auVar99._12_4_ * fVar211;
    auVar227._16_4_ = auVar99._16_4_ * 0.0;
    auVar227._20_4_ = auVar99._20_4_ * 0.0;
    auVar227._24_4_ = auVar99._24_4_ * 0.0;
    auVar227._28_4_ = 0;
    auVar101 = vmulps_avx512vl(auVar220._0_32_,auVar96);
    auVar96 = vsubps_avx(auVar227,auVar101);
    auVar37._4_4_ = auVar100._4_4_ * fVar245 * 0.5;
    auVar37._0_4_ = auVar100._0_4_ * fVar242 * 0.5;
    auVar37._8_4_ = auVar100._8_4_ * fVar237 * 0.5;
    auVar37._12_4_ = auVar100._12_4_ * fVar247 * 0.5;
    auVar37._16_4_ = auVar100._16_4_ * fVar231 * 0.5;
    auVar37._20_4_ = auVar100._20_4_ * fVar232 * 0.5;
    auVar37._24_4_ = auVar100._24_4_ * fVar248 * 0.5;
    auVar37._28_4_ = auVar97._28_4_;
    auVar38._4_4_ = auVar96._4_4_ * 0.5;
    auVar38._0_4_ = auVar96._0_4_ * 0.5;
    auVar38._8_4_ = auVar96._8_4_ * 0.5;
    auVar38._12_4_ = auVar96._12_4_ * 0.5;
    auVar38._16_4_ = auVar96._16_4_ * 0.5;
    auVar38._20_4_ = auVar96._20_4_ * 0.5;
    auVar38._24_4_ = auVar96._24_4_ * 0.5;
    auVar38._28_4_ = auVar96._28_4_;
    auVar39._4_4_ = (fVar245 * fVar245 + auVar101._4_4_) * 0.5;
    auVar39._0_4_ = (fVar242 * fVar242 + auVar101._0_4_) * 0.5;
    auVar39._8_4_ = (fVar237 * fVar237 + auVar101._8_4_) * 0.5;
    auVar39._12_4_ = (fVar247 * fVar247 + auVar101._12_4_) * 0.5;
    auVar39._16_4_ = (fVar231 * fVar231 + auVar101._16_4_) * 0.5;
    auVar39._20_4_ = (fVar232 * fVar232 + auVar101._20_4_) * 0.5;
    auVar39._24_4_ = (fVar248 * fVar248 + auVar101._24_4_) * 0.5;
    auVar39._28_4_ = auVar241._28_4_ + auVar101._28_4_;
    fVar242 = fVar244 * fVar244 * 0.5;
    fVar244 = fVar246 * fVar246 * 0.5;
    fVar245 = fVar238 * fVar238 * 0.5;
    fVar246 = fVar211 * fVar211 * 0.5;
    auVar40._28_4_ = auVar243._28_4_;
    auVar40._0_28_ = ZEXT1628(CONCAT412(fVar246,CONCAT48(fVar245,CONCAT44(fVar244,fVar242))));
    auVar97 = vmulps_avx512vl(local_3c0,auVar40);
    auVar41._4_4_ = fVar244 * (float)local_1e0._4_4_;
    auVar41._0_4_ = fVar242 * (float)local_1e0._0_4_;
    auVar41._8_4_ = fVar245 * fStack_1d8;
    auVar41._12_4_ = fVar246 * fStack_1d4;
    auVar41._16_4_ = fStack_1d0 * 0.0;
    auVar41._20_4_ = fStack_1cc * 0.0;
    auVar41._24_4_ = fStack_1c8 * 0.0;
    auVar41._28_4_ = fVar30;
    auVar96 = vmulps_avx512vl(local_3e0,auVar40);
    auVar42._4_4_ = fVar244 * local_400._4_4_;
    auVar42._0_4_ = fVar242 * local_400._0_4_;
    auVar42._8_4_ = fVar245 * local_400._8_4_;
    auVar42._12_4_ = fVar246 * local_400._12_4_;
    auVar42._16_4_ = local_400._16_4_ * 0.0;
    auVar42._20_4_ = local_400._20_4_ * 0.0;
    auVar42._24_4_ = local_400._24_4_ * 0.0;
    auVar42._28_4_ = auVar243._28_4_;
    auVar97 = vfmadd231ps_avx512vl(auVar97,auVar39,local_340);
    auVar100 = vfmadd231ps_avx512vl(auVar41,auVar39,local_360);
    auVar96 = vfmadd231ps_avx512vl(auVar96,auVar39,local_380);
    auVar101 = vfmadd231ps_avx512vl(auVar42,local_3a0,auVar39);
    auVar97 = vfmadd231ps_avx512vl(auVar97,auVar38,local_2c0);
    auVar100 = vfmadd231ps_avx512vl(auVar100,auVar38,local_2e0);
    auVar96 = vfmadd231ps_avx512vl(auVar96,auVar38,local_300);
    auVar101 = vfmadd231ps_avx512vl(auVar101,local_320,auVar38);
    auVar97 = vfmadd231ps_avx512vl(auVar97,auVar37,local_240);
    auVar100 = vfmadd231ps_avx512vl(auVar100,auVar37,local_260);
    auVar96 = vfmadd231ps_avx512vl(auVar96,auVar37,local_280);
    auVar101 = vfmadd231ps_avx512vl(auVar101,local_2a0,auVar37);
    auVar43._4_4_ = auVar97._4_4_ * fVar239;
    auVar43._0_4_ = auVar97._0_4_ * fVar239;
    auVar43._8_4_ = auVar97._8_4_ * fVar239;
    auVar43._12_4_ = auVar97._12_4_ * fVar239;
    auVar43._16_4_ = auVar97._16_4_ * fVar239;
    auVar43._20_4_ = auVar97._20_4_ * fVar239;
    auVar43._24_4_ = auVar97._24_4_ * fVar239;
    auVar43._28_4_ = auVar99._28_4_;
    auVar251 = ZEXT3264(auVar43);
    auVar44._4_4_ = auVar100._4_4_ * fVar239;
    auVar44._0_4_ = auVar100._0_4_ * fVar239;
    auVar44._8_4_ = auVar100._8_4_ * fVar239;
    auVar44._12_4_ = auVar100._12_4_ * fVar239;
    auVar44._16_4_ = auVar100._16_4_ * fVar239;
    auVar44._20_4_ = auVar100._20_4_ * fVar239;
    auVar44._24_4_ = auVar100._24_4_ * fVar239;
    auVar44._28_4_ = auVar100._28_4_;
    auVar256 = ZEXT3264(auVar44);
    auVar45._4_4_ = auVar96._4_4_ * fVar239;
    auVar45._0_4_ = auVar96._0_4_ * fVar239;
    auVar45._8_4_ = auVar96._8_4_ * fVar239;
    auVar45._12_4_ = auVar96._12_4_ * fVar239;
    auVar45._16_4_ = auVar96._16_4_ * fVar239;
    auVar45._20_4_ = auVar96._20_4_ * fVar239;
    auVar45._24_4_ = auVar96._24_4_ * fVar239;
    auVar45._28_4_ = auVar96._28_4_;
    auVar258 = ZEXT3264(auVar45);
    fVar242 = auVar101._0_4_ * fVar239;
    fVar244 = auVar101._4_4_ * fVar239;
    auVar46._4_4_ = fVar244;
    auVar46._0_4_ = fVar242;
    fVar245 = auVar101._8_4_ * fVar239;
    auVar46._8_4_ = fVar245;
    fVar246 = auVar101._12_4_ * fVar239;
    auVar46._12_4_ = fVar246;
    fVar237 = auVar101._16_4_ * fVar239;
    auVar46._16_4_ = fVar237;
    fVar238 = auVar101._20_4_ * fVar239;
    auVar46._20_4_ = fVar238;
    fVar239 = auVar101._24_4_ * fVar239;
    auVar46._24_4_ = fVar239;
    auVar46._28_4_ = local_400._28_4_;
    auVar84 = vxorps_avx512vl(local_3a0._0_16_,local_3a0._0_16_);
    auVar101 = vpermt2ps_avx512vl(auVar102,_DAT_0205fd20,ZEXT1632(auVar84));
    auVar241 = ZEXT3264(auVar101);
    auVar105 = vpermt2ps_avx512vl(auVar103,_DAT_0205fd20,ZEXT1632(auVar84));
    auVar243 = ZEXT3264(auVar105);
    auVar99 = ZEXT1632(auVar84);
    auVar94 = vpermt2ps_avx512vl(auVar104,_DAT_0205fd20,auVar99);
    auVar249 = ZEXT3264(auVar94);
    auVar228._0_4_ = fVar242 + auVar98._0_4_;
    auVar228._4_4_ = fVar244 + auVar98._4_4_;
    auVar228._8_4_ = fVar245 + auVar98._8_4_;
    auVar228._12_4_ = fVar246 + auVar98._12_4_;
    auVar228._16_4_ = fVar237 + auVar98._16_4_;
    auVar228._20_4_ = fVar238 + auVar98._20_4_;
    auVar228._24_4_ = fVar239 + auVar98._24_4_;
    auVar228._28_4_ = local_400._28_4_ + auVar98._28_4_;
    auVar97 = vmaxps_avx(auVar98,auVar228);
    auVar96 = vminps_avx(auVar98,auVar228);
    auVar95 = vpermt2ps_avx512vl(auVar98,_DAT_0205fd20,auVar99);
    auVar106 = vpermt2ps_avx512vl(auVar43,_DAT_0205fd20,auVar99);
    auVar92 = vpermt2ps_avx512vl(auVar44,_DAT_0205fd20,auVar99);
    auVar118 = ZEXT1632(auVar84);
    auVar93 = vpermt2ps_avx512vl(auVar45,_DAT_0205fd20,auVar118);
    auVar98 = vpermt2ps_avx512vl(auVar46,_DAT_0205fd20,auVar118);
    auVar107 = vsubps_avx512vl(auVar95,auVar98);
    auVar98 = vsubps_avx(auVar101,auVar102);
    auVar99 = vsubps_avx(auVar105,auVar103);
    auVar100 = vsubps_avx(auVar94,auVar104);
    auVar233 = ZEXT3264(auVar100);
    auVar108 = vmulps_avx512vl(auVar99,auVar45);
    auVar108 = vfmsub231ps_avx512vl(auVar108,auVar44,auVar100);
    auVar109 = vmulps_avx512vl(auVar100,auVar43);
    auVar109 = vfmsub231ps_avx512vl(auVar109,auVar45,auVar98);
    auVar110 = vmulps_avx512vl(auVar98,auVar44);
    auVar110 = vfmsub231ps_avx512vl(auVar110,auVar43,auVar99);
    auVar110 = vmulps_avx512vl(auVar110,auVar110);
    auVar109 = vfmadd231ps_avx512vl(auVar110,auVar109,auVar109);
    auVar108 = vfmadd231ps_avx512vl(auVar109,auVar108,auVar108);
    auVar109 = vmulps_avx512vl(auVar100,auVar100);
    auVar109 = vfmadd231ps_avx512vl(auVar109,auVar99,auVar99);
    auVar109 = vfmadd231ps_avx512vl(auVar109,auVar98,auVar98);
    auVar110 = vrcp14ps_avx512vl(auVar109);
    auVar111 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
    auVar112 = vfnmadd213ps_avx512vl(auVar110,auVar109,auVar111);
    auVar110 = vfmadd132ps_avx512vl(auVar112,auVar110,auVar110);
    auVar108 = vmulps_avx512vl(auVar108,auVar110);
    auVar112 = vmulps_avx512vl(auVar99,auVar93);
    auVar112 = vfmsub231ps_avx512vl(auVar112,auVar92,auVar100);
    auVar113 = vmulps_avx512vl(auVar100,auVar106);
    auVar113 = vfmsub231ps_avx512vl(auVar113,auVar93,auVar98);
    auVar114 = vmulps_avx512vl(auVar98,auVar92);
    auVar114 = vfmsub231ps_avx512vl(auVar114,auVar106,auVar99);
    auVar114 = vmulps_avx512vl(auVar114,auVar114);
    auVar113 = vfmadd231ps_avx512vl(auVar114,auVar113,auVar113);
    auVar112 = vfmadd231ps_avx512vl(auVar113,auVar112,auVar112);
    auVar110 = vmulps_avx512vl(auVar112,auVar110);
    auVar108 = vmaxps_avx512vl(auVar108,auVar110);
    auVar108 = vsqrtps_avx512vl(auVar108);
    auVar110 = vmaxps_avx512vl(auVar107,auVar95);
    auVar97 = vmaxps_avx512vl(auVar97,auVar110);
    auVar110 = vaddps_avx512vl(auVar108,auVar97);
    auVar97 = vminps_avx512vl(auVar107,auVar95);
    auVar97 = vminps_avx(auVar96,auVar97);
    auVar97 = vsubps_avx512vl(auVar97,auVar108);
    auVar119._8_4_ = 0x3f800002;
    auVar119._0_8_ = 0x3f8000023f800002;
    auVar119._12_4_ = 0x3f800002;
    auVar119._16_4_ = 0x3f800002;
    auVar119._20_4_ = 0x3f800002;
    auVar119._24_4_ = 0x3f800002;
    auVar119._28_4_ = 0x3f800002;
    auVar96 = vmulps_avx512vl(auVar110,auVar119);
    auVar122._8_4_ = 0x3f7ffffc;
    auVar122._0_8_ = 0x3f7ffffc3f7ffffc;
    auVar122._12_4_ = 0x3f7ffffc;
    auVar122._16_4_ = 0x3f7ffffc;
    auVar122._20_4_ = 0x3f7ffffc;
    auVar122._24_4_ = 0x3f7ffffc;
    auVar122._28_4_ = 0x3f7ffffc;
    auVar95 = vmulps_avx512vl(auVar97,auVar122);
    auVar47._4_4_ = auVar96._4_4_ * auVar96._4_4_;
    auVar47._0_4_ = auVar96._0_4_ * auVar96._0_4_;
    auVar47._8_4_ = auVar96._8_4_ * auVar96._8_4_;
    auVar47._12_4_ = auVar96._12_4_ * auVar96._12_4_;
    auVar47._16_4_ = auVar96._16_4_ * auVar96._16_4_;
    auVar47._20_4_ = auVar96._20_4_ * auVar96._20_4_;
    auVar47._24_4_ = auVar96._24_4_ * auVar96._24_4_;
    auVar47._28_4_ = auVar95._28_4_;
    auVar97 = vrsqrt14ps_avx512vl(auVar109);
    auVar123._8_4_ = 0xbf000000;
    auVar123._0_8_ = 0xbf000000bf000000;
    auVar123._12_4_ = 0xbf000000;
    auVar123._16_4_ = 0xbf000000;
    auVar123._20_4_ = 0xbf000000;
    auVar123._24_4_ = 0xbf000000;
    auVar123._28_4_ = 0xbf000000;
    auVar96 = vmulps_avx512vl(auVar109,auVar123);
    auVar48._4_4_ = auVar97._4_4_ * auVar96._4_4_;
    auVar48._0_4_ = auVar97._0_4_ * auVar96._0_4_;
    auVar48._8_4_ = auVar97._8_4_ * auVar96._8_4_;
    auVar48._12_4_ = auVar97._12_4_ * auVar96._12_4_;
    auVar48._16_4_ = auVar97._16_4_ * auVar96._16_4_;
    auVar48._20_4_ = auVar97._20_4_ * auVar96._20_4_;
    auVar48._24_4_ = auVar97._24_4_ * auVar96._24_4_;
    auVar48._28_4_ = auVar96._28_4_;
    auVar96 = vmulps_avx512vl(auVar97,auVar97);
    auVar96 = vmulps_avx512vl(auVar96,auVar48);
    auVar124._8_4_ = 0x3fc00000;
    auVar124._0_8_ = 0x3fc000003fc00000;
    auVar124._12_4_ = 0x3fc00000;
    auVar124._16_4_ = 0x3fc00000;
    auVar124._20_4_ = 0x3fc00000;
    auVar124._24_4_ = 0x3fc00000;
    auVar124._28_4_ = 0x3fc00000;
    auVar96 = vfmadd231ps_avx512vl(auVar96,auVar97,auVar124);
    auVar49._4_4_ = auVar96._4_4_ * auVar98._4_4_;
    auVar49._0_4_ = auVar96._0_4_ * auVar98._0_4_;
    auVar49._8_4_ = auVar96._8_4_ * auVar98._8_4_;
    auVar49._12_4_ = auVar96._12_4_ * auVar98._12_4_;
    auVar49._16_4_ = auVar96._16_4_ * auVar98._16_4_;
    auVar49._20_4_ = auVar96._20_4_ * auVar98._20_4_;
    auVar49._24_4_ = auVar96._24_4_ * auVar98._24_4_;
    auVar49._28_4_ = auVar97._28_4_;
    auVar97 = vmulps_avx512vl(auVar99,auVar96);
    auVar107 = vmulps_avx512vl(auVar100,auVar96);
    auVar108 = vsubps_avx512vl(auVar118,auVar102);
    auVar109 = vsubps_avx512vl(auVar118,auVar103);
    auVar110 = vsubps_avx512vl(auVar118,auVar104);
    auVar112 = vmulps_avx512vl(local_4e0,auVar110);
    auVar112 = vfmadd231ps_avx512vl(auVar112,local_4c0,auVar109);
    auVar112 = vfmadd231ps_avx512vl(auVar112,local_4a0,auVar108);
    auVar113 = vmulps_avx512vl(auVar110,auVar110);
    auVar113 = vfmadd231ps_avx512vl(auVar113,auVar109,auVar109);
    auVar113 = vfmadd231ps_avx512vl(auVar113,auVar108,auVar108);
    auVar114 = vmulps_avx512vl(local_4e0,auVar107);
    auVar114 = vfmadd231ps_avx512vl(auVar114,auVar97,local_4c0);
    auVar114 = vfmadd231ps_avx512vl(auVar114,auVar49,local_4a0);
    auVar107 = vmulps_avx512vl(auVar110,auVar107);
    auVar97 = vfmadd231ps_avx512vl(auVar107,auVar109,auVar97);
    auVar107 = vfmadd231ps_avx512vl(auVar97,auVar108,auVar49);
    local_8c0 = vmulps_avx512vl(auVar114,auVar114);
    auVar115 = vsubps_avx512vl(local_200,local_8c0);
    auVar97 = vmulps_avx512vl(auVar114,auVar107);
    auVar97 = vsubps_avx512vl(auVar112,auVar97);
    auVar112 = vaddps_avx512vl(auVar97,auVar97);
    auVar97 = vmulps_avx512vl(auVar107,auVar107);
    local_820 = vsubps_avx512vl(auVar113,auVar97);
    auVar97 = vsubps_avx(local_820,auVar47);
    auVar113 = vmulps_avx512vl(auVar112,auVar112);
    auVar125._8_4_ = 0x40800000;
    auVar125._0_8_ = 0x4080000040800000;
    auVar125._12_4_ = 0x40800000;
    auVar125._16_4_ = 0x40800000;
    auVar125._20_4_ = 0x40800000;
    auVar125._24_4_ = 0x40800000;
    auVar125._28_4_ = 0x40800000;
    auVar116 = vmulps_avx512vl(auVar115,auVar125);
    auVar117 = vmulps_avx512vl(auVar116,auVar97);
    auVar117 = vsubps_avx512vl(auVar113,auVar117);
    uVar80 = vcmpps_avx512vl(auVar117,auVar118,5);
    bVar69 = (byte)uVar80;
    if (bVar69 == 0) {
      auVar120 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar121 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
    }
    else {
      auVar117 = vsqrtps_avx512vl(auVar117);
      auVar118 = vaddps_avx512vl(auVar115,auVar115);
      auVar119 = vrcp14ps_avx512vl(auVar118);
      auVar118 = vfnmadd213ps_avx512vl(auVar118,auVar119,auVar111);
      auVar118 = vfmadd132ps_avx512vl(auVar118,auVar119,auVar119);
      auVar18._8_4_ = 0x80000000;
      auVar18._0_8_ = 0x8000000080000000;
      auVar18._12_4_ = 0x80000000;
      auVar18._16_4_ = 0x80000000;
      auVar18._20_4_ = 0x80000000;
      auVar18._24_4_ = 0x80000000;
      auVar18._28_4_ = 0x80000000;
      auVar119 = vxorps_avx512vl(auVar112,auVar18);
      auVar119 = vsubps_avx512vl(auVar119,auVar117);
      auVar119 = vmulps_avx512vl(auVar119,auVar118);
      auVar117 = vsubps_avx512vl(auVar117,auVar112);
      auVar117 = vmulps_avx512vl(auVar117,auVar118);
      auVar118 = vfmadd213ps_avx512vl(auVar114,auVar119,auVar107);
      local_540 = vmulps_avx512vl(auVar96,auVar118);
      auVar118 = vfmadd213ps_avx512vl(auVar114,auVar117,auVar107);
      local_560 = vmulps_avx512vl(auVar96,auVar118);
      auVar118 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar118 = vblendmps_avx512vl(auVar118,auVar119);
      auVar120._0_4_ =
           (uint)(bVar69 & 1) * auVar118._0_4_ | (uint)!(bool)(bVar69 & 1) * local_560._0_4_;
      bVar78 = (bool)((byte)(uVar80 >> 1) & 1);
      auVar120._4_4_ = (uint)bVar78 * auVar118._4_4_ | (uint)!bVar78 * local_560._4_4_;
      bVar78 = (bool)((byte)(uVar80 >> 2) & 1);
      auVar120._8_4_ = (uint)bVar78 * auVar118._8_4_ | (uint)!bVar78 * local_560._8_4_;
      bVar78 = (bool)((byte)(uVar80 >> 3) & 1);
      auVar120._12_4_ = (uint)bVar78 * auVar118._12_4_ | (uint)!bVar78 * local_560._12_4_;
      bVar78 = (bool)((byte)(uVar80 >> 4) & 1);
      auVar120._16_4_ = (uint)bVar78 * auVar118._16_4_ | (uint)!bVar78 * local_560._16_4_;
      bVar78 = (bool)((byte)(uVar80 >> 5) & 1);
      auVar120._20_4_ = (uint)bVar78 * auVar118._20_4_ | (uint)!bVar78 * local_560._20_4_;
      bVar78 = (bool)((byte)(uVar80 >> 6) & 1);
      auVar120._24_4_ = (uint)bVar78 * auVar118._24_4_ | (uint)!bVar78 * local_560._24_4_;
      bVar78 = SUB81(uVar80 >> 7,0);
      auVar120._28_4_ = (uint)bVar78 * auVar118._28_4_ | (uint)!bVar78 * local_560._28_4_;
      auVar216._8_4_ = 0xff800000;
      auVar216._0_8_ = 0xff800000ff800000;
      auVar216._12_4_ = 0xff800000;
      auVar216._16_4_ = 0xff800000;
      auVar216._20_4_ = 0xff800000;
      auVar216._24_4_ = 0xff800000;
      auVar216._28_4_ = 0xff800000;
      auVar118 = vblendmps_avx512vl(auVar216,auVar117);
      auVar121._0_4_ =
           (uint)(bVar69 & 1) * auVar118._0_4_ | (uint)!(bool)(bVar69 & 1) * auVar117._0_4_;
      bVar78 = (bool)((byte)(uVar80 >> 1) & 1);
      auVar121._4_4_ = (uint)bVar78 * auVar118._4_4_ | (uint)!bVar78 * auVar117._4_4_;
      bVar78 = (bool)((byte)(uVar80 >> 2) & 1);
      auVar121._8_4_ = (uint)bVar78 * auVar118._8_4_ | (uint)!bVar78 * auVar117._8_4_;
      bVar78 = (bool)((byte)(uVar80 >> 3) & 1);
      auVar121._12_4_ = (uint)bVar78 * auVar118._12_4_ | (uint)!bVar78 * auVar117._12_4_;
      bVar78 = (bool)((byte)(uVar80 >> 4) & 1);
      auVar121._16_4_ = (uint)bVar78 * auVar118._16_4_ | (uint)!bVar78 * auVar117._16_4_;
      bVar78 = (bool)((byte)(uVar80 >> 5) & 1);
      auVar121._20_4_ = (uint)bVar78 * auVar118._20_4_ | (uint)!bVar78 * auVar117._20_4_;
      bVar78 = (bool)((byte)(uVar80 >> 6) & 1);
      auVar121._24_4_ = (uint)bVar78 * auVar118._24_4_ | (uint)!bVar78 * auVar117._24_4_;
      bVar78 = SUB81(uVar80 >> 7,0);
      auVar121._28_4_ = (uint)bVar78 * auVar118._28_4_ | (uint)!bVar78 * auVar117._28_4_;
      auVar117 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      vandps_avx512vl(local_8c0,auVar117);
      auVar118 = vmaxps_avx512vl(local_500,auVar117);
      auVar19._8_4_ = 0x36000000;
      auVar19._0_8_ = 0x3600000036000000;
      auVar19._12_4_ = 0x36000000;
      auVar19._16_4_ = 0x36000000;
      auVar19._20_4_ = 0x36000000;
      auVar19._24_4_ = 0x36000000;
      auVar19._28_4_ = 0x36000000;
      auVar118 = vmulps_avx512vl(auVar118,auVar19);
      vandps_avx512vl(auVar115,auVar117);
      uVar74 = vcmpps_avx512vl(auVar118,auVar118,1);
      uVar80 = uVar80 & uVar74;
      bVar76 = (byte)uVar80;
      if (bVar76 != 0) {
        uVar74 = vcmpps_avx512vl(auVar97,_DAT_02020f00,2);
        auVar230._8_4_ = 0xff800000;
        auVar230._0_8_ = 0xff800000ff800000;
        auVar230._12_4_ = 0xff800000;
        auVar230._16_4_ = 0xff800000;
        auVar230._20_4_ = 0xff800000;
        auVar230._24_4_ = 0xff800000;
        auVar230._28_4_ = 0xff800000;
        auVar97 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
        auVar117 = vblendmps_avx512vl(auVar97,auVar230);
        bVar71 = (byte)uVar74;
        uVar81 = (uint)(bVar71 & 1) * auVar117._0_4_ | (uint)!(bool)(bVar71 & 1) * auVar118._0_4_;
        bVar78 = (bool)((byte)(uVar74 >> 1) & 1);
        uVar140 = (uint)bVar78 * auVar117._4_4_ | (uint)!bVar78 * auVar118._4_4_;
        bVar78 = (bool)((byte)(uVar74 >> 2) & 1);
        uVar141 = (uint)bVar78 * auVar117._8_4_ | (uint)!bVar78 * auVar118._8_4_;
        bVar78 = (bool)((byte)(uVar74 >> 3) & 1);
        uVar142 = (uint)bVar78 * auVar117._12_4_ | (uint)!bVar78 * auVar118._12_4_;
        bVar78 = (bool)((byte)(uVar74 >> 4) & 1);
        uVar143 = (uint)bVar78 * auVar117._16_4_ | (uint)!bVar78 * auVar118._16_4_;
        bVar78 = (bool)((byte)(uVar74 >> 5) & 1);
        uVar144 = (uint)bVar78 * auVar117._20_4_ | (uint)!bVar78 * auVar118._20_4_;
        bVar78 = (bool)((byte)(uVar74 >> 6) & 1);
        uVar145 = (uint)bVar78 * auVar117._24_4_ | (uint)!bVar78 * auVar118._24_4_;
        bVar78 = SUB81(uVar74 >> 7,0);
        uVar146 = (uint)bVar78 * auVar117._28_4_ | (uint)!bVar78 * auVar118._28_4_;
        auVar120._0_4_ = (bVar76 & 1) * uVar81 | !(bool)(bVar76 & 1) * auVar120._0_4_;
        bVar78 = (bool)((byte)(uVar80 >> 1) & 1);
        auVar120._4_4_ = bVar78 * uVar140 | !bVar78 * auVar120._4_4_;
        bVar78 = (bool)((byte)(uVar80 >> 2) & 1);
        auVar120._8_4_ = bVar78 * uVar141 | !bVar78 * auVar120._8_4_;
        bVar78 = (bool)((byte)(uVar80 >> 3) & 1);
        auVar120._12_4_ = bVar78 * uVar142 | !bVar78 * auVar120._12_4_;
        bVar78 = (bool)((byte)(uVar80 >> 4) & 1);
        auVar120._16_4_ = bVar78 * uVar143 | !bVar78 * auVar120._16_4_;
        bVar78 = (bool)((byte)(uVar80 >> 5) & 1);
        auVar120._20_4_ = bVar78 * uVar144 | !bVar78 * auVar120._20_4_;
        bVar78 = (bool)((byte)(uVar80 >> 6) & 1);
        auVar120._24_4_ = bVar78 * uVar145 | !bVar78 * auVar120._24_4_;
        bVar78 = SUB81(uVar80 >> 7,0);
        auVar120._28_4_ = bVar78 * uVar146 | !bVar78 * auVar120._28_4_;
        auVar97 = vblendmps_avx512vl(auVar230,auVar97);
        bVar78 = (bool)((byte)(uVar74 >> 1) & 1);
        bVar6 = (bool)((byte)(uVar74 >> 2) & 1);
        bVar7 = (bool)((byte)(uVar74 >> 3) & 1);
        bVar8 = (bool)((byte)(uVar74 >> 4) & 1);
        bVar9 = (bool)((byte)(uVar74 >> 5) & 1);
        bVar10 = (bool)((byte)(uVar74 >> 6) & 1);
        bVar11 = SUB81(uVar74 >> 7,0);
        auVar121._0_4_ =
             (uint)(bVar76 & 1) *
             ((uint)(bVar71 & 1) * auVar97._0_4_ | !(bool)(bVar71 & 1) * uVar81) |
             !(bool)(bVar76 & 1) * auVar121._0_4_;
        bVar5 = (bool)((byte)(uVar80 >> 1) & 1);
        auVar121._4_4_ =
             (uint)bVar5 * ((uint)bVar78 * auVar97._4_4_ | !bVar78 * uVar140) |
             !bVar5 * auVar121._4_4_;
        bVar78 = (bool)((byte)(uVar80 >> 2) & 1);
        auVar121._8_4_ =
             (uint)bVar78 * ((uint)bVar6 * auVar97._8_4_ | !bVar6 * uVar141) |
             !bVar78 * auVar121._8_4_;
        bVar78 = (bool)((byte)(uVar80 >> 3) & 1);
        auVar121._12_4_ =
             (uint)bVar78 * ((uint)bVar7 * auVar97._12_4_ | !bVar7 * uVar142) |
             !bVar78 * auVar121._12_4_;
        bVar78 = (bool)((byte)(uVar80 >> 4) & 1);
        auVar121._16_4_ =
             (uint)bVar78 * ((uint)bVar8 * auVar97._16_4_ | !bVar8 * uVar143) |
             !bVar78 * auVar121._16_4_;
        bVar78 = (bool)((byte)(uVar80 >> 5) & 1);
        auVar121._20_4_ =
             (uint)bVar78 * ((uint)bVar9 * auVar97._20_4_ | !bVar9 * uVar144) |
             !bVar78 * auVar121._20_4_;
        bVar78 = (bool)((byte)(uVar80 >> 6) & 1);
        auVar121._24_4_ =
             (uint)bVar78 * ((uint)bVar10 * auVar97._24_4_ | !bVar10 * uVar145) |
             !bVar78 * auVar121._24_4_;
        bVar78 = SUB81(uVar80 >> 7,0);
        auVar121._28_4_ =
             (uint)bVar78 * ((uint)bVar11 * auVar97._28_4_ | !bVar11 * uVar146) |
             !bVar78 * auVar121._28_4_;
        bVar69 = (~bVar76 | bVar71) & bVar69;
      }
      auVar111._8_4_ = 0x3f800000;
      auVar111._0_8_ = &DAT_3f8000003f800000;
      auVar111._12_4_ = 0x3f800000;
      auVar111._16_4_ = 0x3f800000;
      auVar111._20_4_ = 0x3f800000;
      auVar111._24_4_ = 0x3f800000;
      auVar111._28_4_ = 0x3f800000;
    }
    auVar220 = ZEXT3264(auVar111);
    if ((bVar69 & 0x7f) == 0) {
      auVar97 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      auVar260 = ZEXT3264(auVar97);
      auVar207 = ZEXT1664(local_890);
    }
    else {
      fVar242 = *(float *)(ray + k * 4 + 0x80) - (float)local_730._0_4_;
      auVar217._4_4_ = fVar242;
      auVar217._0_4_ = fVar242;
      auVar217._8_4_ = fVar242;
      auVar217._12_4_ = fVar242;
      auVar217._16_4_ = fVar242;
      auVar217._20_4_ = fVar242;
      auVar217._24_4_ = fVar242;
      auVar217._28_4_ = fVar242;
      auVar117 = vminps_avx512vl(auVar217,auVar121);
      auVar68._4_4_ = fStack_21c;
      auVar68._0_4_ = local_220;
      auVar68._8_4_ = fStack_218;
      auVar68._12_4_ = fStack_214;
      auVar68._16_4_ = fStack_210;
      auVar68._20_4_ = fStack_20c;
      auVar68._24_4_ = fStack_208;
      auVar68._28_4_ = fStack_204;
      auVar97 = vmaxps_avx512vl(auVar68,auVar120);
      auVar110 = vmulps_avx512vl(auVar45,auVar110);
      auVar109 = vfmadd213ps_avx512vl(auVar109,auVar44,auVar110);
      auVar108 = vfmadd213ps_avx512vl(auVar108,auVar43,auVar109);
      auVar109 = vmulps_avx512vl(local_4e0,auVar45);
      auVar109 = vfmadd231ps_avx512vl(auVar109,local_4c0,auVar44);
      auVar109 = vfmadd231ps_avx512vl(auVar109,local_4a0,auVar43);
      auVar110 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      auVar260 = ZEXT3264(auVar110);
      vandps_avx512vl(auVar109,auVar110);
      auVar118 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
      uVar12 = vcmpps_avx512vl(auVar110,auVar118,1);
      auVar119 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
      auVar108 = vxorps_avx512vl(auVar108,auVar119);
      auVar122 = vrcp14ps_avx512vl(auVar109);
      auVar123 = vxorps_avx512vl(auVar109,auVar119);
      auVar124 = vfnmadd213ps_avx512vl(auVar122,auVar109,auVar111);
      auVar124 = vfmadd132ps_avx512vl(auVar124,auVar122,auVar122);
      auVar108 = vmulps_avx512vl(auVar124,auVar108);
      uVar13 = vcmpps_avx512vl(auVar109,auVar123,1);
      bVar76 = (byte)uVar12 | (byte)uVar13;
      auVar124 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
      auVar125 = vblendmps_avx512vl(auVar108,auVar124);
      auVar126._0_4_ =
           (uint)(bVar76 & 1) * auVar125._0_4_ | (uint)!(bool)(bVar76 & 1) * auVar122._0_4_;
      bVar78 = (bool)(bVar76 >> 1 & 1);
      auVar126._4_4_ = (uint)bVar78 * auVar125._4_4_ | (uint)!bVar78 * auVar122._4_4_;
      bVar78 = (bool)(bVar76 >> 2 & 1);
      auVar126._8_4_ = (uint)bVar78 * auVar125._8_4_ | (uint)!bVar78 * auVar122._8_4_;
      bVar78 = (bool)(bVar76 >> 3 & 1);
      auVar126._12_4_ = (uint)bVar78 * auVar125._12_4_ | (uint)!bVar78 * auVar122._12_4_;
      bVar78 = (bool)(bVar76 >> 4 & 1);
      auVar126._16_4_ = (uint)bVar78 * auVar125._16_4_ | (uint)!bVar78 * auVar122._16_4_;
      bVar78 = (bool)(bVar76 >> 5 & 1);
      auVar126._20_4_ = (uint)bVar78 * auVar125._20_4_ | (uint)!bVar78 * auVar122._20_4_;
      bVar78 = (bool)(bVar76 >> 6 & 1);
      auVar126._24_4_ = (uint)bVar78 * auVar125._24_4_ | (uint)!bVar78 * auVar122._24_4_;
      auVar126._28_4_ =
           (uint)(bVar76 >> 7) * auVar125._28_4_ | (uint)!(bool)(bVar76 >> 7) * auVar122._28_4_;
      auVar97 = vmaxps_avx(auVar97,auVar126);
      uVar13 = vcmpps_avx512vl(auVar109,auVar123,6);
      bVar76 = (byte)uVar12 | (byte)uVar13;
      auVar258 = ZEXT3264(CONCAT428(0x7f800000,
                                    CONCAT424(0x7f800000,
                                              CONCAT420(0x7f800000,
                                                        CONCAT416(0x7f800000,
                                                                  CONCAT412(0x7f800000,
                                                                            CONCAT48(0x7f800000,
                                                                                                                                                                          
                                                  0x7f8000007f800000)))))));
      auVar127._0_4_ = (uint)(bVar76 & 1) * 0x7f800000 | (uint)!(bool)(bVar76 & 1) * auVar108._0_4_;
      bVar78 = (bool)(bVar76 >> 1 & 1);
      auVar127._4_4_ = (uint)bVar78 * 0x7f800000 | (uint)!bVar78 * auVar108._4_4_;
      bVar78 = (bool)(bVar76 >> 2 & 1);
      auVar127._8_4_ = (uint)bVar78 * 0x7f800000 | (uint)!bVar78 * auVar108._8_4_;
      bVar78 = (bool)(bVar76 >> 3 & 1);
      auVar127._12_4_ = (uint)bVar78 * 0x7f800000 | (uint)!bVar78 * auVar108._12_4_;
      bVar78 = (bool)(bVar76 >> 4 & 1);
      auVar127._16_4_ = (uint)bVar78 * 0x7f800000 | (uint)!bVar78 * auVar108._16_4_;
      bVar78 = (bool)(bVar76 >> 5 & 1);
      auVar127._20_4_ = (uint)bVar78 * 0x7f800000 | (uint)!bVar78 * auVar108._20_4_;
      bVar78 = (bool)(bVar76 >> 6 & 1);
      auVar127._24_4_ = (uint)bVar78 * 0x7f800000 | (uint)!bVar78 * auVar108._24_4_;
      auVar127._28_4_ =
           (uint)(bVar76 >> 7) * 0x7f800000 | (uint)!(bool)(bVar76 >> 7) * auVar108._28_4_;
      auVar108 = vminps_avx(auVar117,auVar127);
      auVar84 = vxorps_avx512vl(auVar123._0_16_,auVar123._0_16_);
      auVar101 = vsubps_avx512vl(ZEXT1632(auVar84),auVar101);
      auVar105 = vsubps_avx512vl(ZEXT1632(auVar84),auVar105);
      auVar109 = ZEXT1632(auVar84);
      auVar94 = vsubps_avx512vl(auVar109,auVar94);
      auVar50._4_4_ = auVar94._4_4_ * auVar93._4_4_;
      auVar50._0_4_ = auVar94._0_4_ * auVar93._0_4_;
      auVar50._8_4_ = auVar94._8_4_ * auVar93._8_4_;
      auVar50._12_4_ = auVar94._12_4_ * auVar93._12_4_;
      auVar50._16_4_ = auVar94._16_4_ * auVar93._16_4_;
      auVar50._20_4_ = auVar94._20_4_ * auVar93._20_4_;
      auVar50._24_4_ = auVar94._24_4_ * auVar93._24_4_;
      auVar50._28_4_ = auVar94._28_4_;
      auVar105 = vfnmsub231ps_avx512vl(auVar50,auVar92,auVar105);
      auVar101 = vfnmadd231ps_avx512vl(auVar105,auVar106,auVar101);
      auVar105 = vmulps_avx512vl(local_4e0,auVar93);
      auVar105 = vfnmsub231ps_avx512vl(auVar105,local_4c0,auVar92);
      auVar105 = vfnmadd231ps_avx512vl(auVar105,local_4a0,auVar106);
      vandps_avx512vl(auVar105,auVar110);
      uVar12 = vcmpps_avx512vl(auVar105,auVar118,1);
      auVar101 = vxorps_avx512vl(auVar101,auVar119);
      auVar94 = vrcp14ps_avx512vl(auVar105);
      auVar106 = vxorps_avx512vl(auVar105,auVar119);
      auVar251 = ZEXT3264(auVar106);
      auVar93 = vfnmadd213ps_avx512vl(auVar94,auVar105,auVar111);
      auVar84 = vfmadd132ps_fma(auVar93,auVar94,auVar94);
      auVar256 = ZEXT1664(auVar84);
      fVar242 = auVar84._0_4_ * auVar101._0_4_;
      fVar244 = auVar84._4_4_ * auVar101._4_4_;
      auVar51._4_4_ = fVar244;
      auVar51._0_4_ = fVar242;
      fVar245 = auVar84._8_4_ * auVar101._8_4_;
      auVar51._8_4_ = fVar245;
      fVar246 = auVar84._12_4_ * auVar101._12_4_;
      auVar51._12_4_ = fVar246;
      fVar237 = auVar101._16_4_ * 0.0;
      auVar51._16_4_ = fVar237;
      fVar238 = auVar101._20_4_ * 0.0;
      auVar51._20_4_ = fVar238;
      fVar247 = auVar101._24_4_ * 0.0;
      auVar51._24_4_ = fVar247;
      auVar51._28_4_ = auVar101._28_4_;
      uVar13 = vcmpps_avx512vl(auVar105,auVar106,1);
      bVar76 = (byte)uVar12 | (byte)uVar13;
      auVar93 = vblendmps_avx512vl(auVar51,auVar124);
      auVar128._0_4_ =
           (uint)(bVar76 & 1) * auVar93._0_4_ | (uint)!(bool)(bVar76 & 1) * auVar94._0_4_;
      bVar78 = (bool)(bVar76 >> 1 & 1);
      auVar128._4_4_ = (uint)bVar78 * auVar93._4_4_ | (uint)!bVar78 * auVar94._4_4_;
      bVar78 = (bool)(bVar76 >> 2 & 1);
      auVar128._8_4_ = (uint)bVar78 * auVar93._8_4_ | (uint)!bVar78 * auVar94._8_4_;
      bVar78 = (bool)(bVar76 >> 3 & 1);
      auVar128._12_4_ = (uint)bVar78 * auVar93._12_4_ | (uint)!bVar78 * auVar94._12_4_;
      bVar78 = (bool)(bVar76 >> 4 & 1);
      auVar128._16_4_ = (uint)bVar78 * auVar93._16_4_ | (uint)!bVar78 * auVar94._16_4_;
      bVar78 = (bool)(bVar76 >> 5 & 1);
      auVar128._20_4_ = (uint)bVar78 * auVar93._20_4_ | (uint)!bVar78 * auVar94._20_4_;
      bVar78 = (bool)(bVar76 >> 6 & 1);
      auVar128._24_4_ = (uint)bVar78 * auVar93._24_4_ | (uint)!bVar78 * auVar94._24_4_;
      auVar128._28_4_ =
           (uint)(bVar76 >> 7) * auVar93._28_4_ | (uint)!(bool)(bVar76 >> 7) * auVar94._28_4_;
      auVar249 = ZEXT3264(auVar128);
      _local_6c0 = vmaxps_avx(auVar97,auVar128);
      uVar13 = vcmpps_avx512vl(auVar105,auVar106,6);
      bVar76 = (byte)uVar12 | (byte)uVar13;
      auVar129._0_4_ = (uint)(bVar76 & 1) * 0x7f800000 | (uint)!(bool)(bVar76 & 1) * (int)fVar242;
      bVar78 = (bool)(bVar76 >> 1 & 1);
      auVar129._4_4_ = (uint)bVar78 * 0x7f800000 | (uint)!bVar78 * (int)fVar244;
      bVar78 = (bool)(bVar76 >> 2 & 1);
      auVar129._8_4_ = (uint)bVar78 * 0x7f800000 | (uint)!bVar78 * (int)fVar245;
      bVar78 = (bool)(bVar76 >> 3 & 1);
      auVar129._12_4_ = (uint)bVar78 * 0x7f800000 | (uint)!bVar78 * (int)fVar246;
      bVar78 = (bool)(bVar76 >> 4 & 1);
      auVar129._16_4_ = (uint)bVar78 * 0x7f800000 | (uint)!bVar78 * (int)fVar237;
      bVar78 = (bool)(bVar76 >> 5 & 1);
      auVar129._20_4_ = (uint)bVar78 * 0x7f800000 | (uint)!bVar78 * (int)fVar238;
      bVar78 = (bool)(bVar76 >> 6 & 1);
      auVar129._24_4_ = (uint)bVar78 * 0x7f800000 | (uint)!bVar78 * (int)fVar247;
      auVar129._28_4_ =
           (uint)(bVar76 >> 7) * 0x7f800000 | (uint)!(bool)(bVar76 >> 7) * auVar101._28_4_;
      auVar243 = ZEXT3264(auVar129);
      local_460 = vminps_avx(auVar108,auVar129);
      auVar241 = ZEXT3264(local_460);
      uVar12 = vcmpps_avx512vl(_local_6c0,local_460,2);
      bVar69 = bVar69 & 0x7f & (byte)uVar12;
      if (bVar69 == 0) {
        auVar220 = ZEXT3264(auVar111);
        auVar207 = ZEXT1664(local_890);
      }
      else {
        auVar101 = vmaxps_avx512vl(auVar109,auVar95);
        auVar97 = vminps_avx512vl(local_540,auVar111);
        auVar57 = ZEXT412(0);
        auVar249 = ZEXT1264(auVar57) << 0x20;
        auVar97 = vmaxps_avx(auVar97,ZEXT1232(auVar57) << 0x20);
        auVar105 = vminps_avx512vl(local_560,auVar111);
        auVar256 = ZEXT3264(CONCAT428(0x3e000000,
                                      CONCAT424(0x3e000000,
                                                CONCAT420(0x3e000000,
                                                          CONCAT416(0x3e000000,
                                                                    CONCAT412(0x3e000000,
                                                                              CONCAT48(0x3e000000,
                                                                                                                                                                              
                                                  0x3e0000003e000000)))))));
        auVar52._4_4_ = (auVar97._4_4_ + 1.0) * 0.125;
        auVar52._0_4_ = (auVar97._0_4_ + 0.0) * 0.125;
        auVar52._8_4_ = (auVar97._8_4_ + 2.0) * 0.125;
        auVar52._12_4_ = (auVar97._12_4_ + 3.0) * 0.125;
        auVar52._16_4_ = (auVar97._16_4_ + 4.0) * 0.125;
        auVar52._20_4_ = (auVar97._20_4_ + 5.0) * 0.125;
        auVar52._24_4_ = (auVar97._24_4_ + 6.0) * 0.125;
        auVar52._28_4_ = auVar97._28_4_ + 7.0;
        auVar258 = ZEXT3264(local_800);
        auVar84 = vfmadd213ps_fma(auVar52,local_800,auVar226);
        local_540 = ZEXT1632(auVar84);
        auVar97 = vmaxps_avx(auVar105,ZEXT1232(auVar57) << 0x20);
        auVar53._4_4_ = (auVar97._4_4_ + 1.0) * 0.125;
        auVar53._0_4_ = (auVar97._0_4_ + 0.0) * 0.125;
        auVar53._8_4_ = (auVar97._8_4_ + 2.0) * 0.125;
        auVar53._12_4_ = (auVar97._12_4_ + 3.0) * 0.125;
        auVar53._16_4_ = (auVar97._16_4_ + 4.0) * 0.125;
        auVar53._20_4_ = (auVar97._20_4_ + 5.0) * 0.125;
        auVar53._24_4_ = (auVar97._24_4_ + 6.0) * 0.125;
        auVar53._28_4_ = auVar97._28_4_ + 7.0;
        auVar84 = vfmadd213ps_fma(auVar53,local_800,auVar226);
        local_560 = ZEXT1632(auVar84);
        auVar218._0_4_ = auVar101._0_4_ * auVar101._0_4_;
        auVar218._4_4_ = auVar101._4_4_ * auVar101._4_4_;
        auVar218._8_4_ = auVar101._8_4_ * auVar101._8_4_;
        auVar218._12_4_ = auVar101._12_4_ * auVar101._12_4_;
        auVar218._16_4_ = auVar101._16_4_ * auVar101._16_4_;
        auVar218._20_4_ = auVar101._20_4_ * auVar101._20_4_;
        auVar218._24_4_ = auVar101._24_4_ * auVar101._24_4_;
        auVar218._28_4_ = 0;
        auVar97 = vsubps_avx(local_820,auVar218);
        auVar251 = ZEXT3264(auVar97);
        auVar101 = vmulps_avx512vl(auVar116,auVar97);
        auVar101 = vsubps_avx512vl(auVar113,auVar101);
        uVar12 = vcmpps_avx512vl(auVar101,ZEXT1232(auVar57) << 0x20,5);
        bVar76 = (byte)uVar12;
        if (bVar76 == 0) {
          auVar96 = ZEXT1232(ZEXT812(0)) << 0x20;
          auVar98 = ZEXT1232(ZEXT812(0)) << 0x20;
          auVar101 = SUB6432(ZEXT864(0),0) << 0x20;
          auVar105 = SUB6432(ZEXT864(0),0) << 0x20;
          auVar243 = ZEXT864(0) << 0x20;
          auVar130._8_4_ = 0x7f800000;
          auVar130._0_8_ = 0x7f8000007f800000;
          auVar130._12_4_ = 0x7f800000;
          auVar130._16_4_ = 0x7f800000;
          auVar130._20_4_ = 0x7f800000;
          auVar130._24_4_ = 0x7f800000;
          auVar130._28_4_ = 0x7f800000;
          auVar131._8_4_ = 0xff800000;
          auVar131._0_8_ = 0xff800000ff800000;
          auVar131._12_4_ = 0xff800000;
          auVar131._16_4_ = 0xff800000;
          auVar131._20_4_ = 0xff800000;
          auVar131._24_4_ = 0xff800000;
          auVar131._28_4_ = 0xff800000;
        }
        else {
          auVar85 = vxorps_avx512vl(auVar92._0_16_,auVar92._0_16_);
          uVar80 = vcmpps_avx512vl(auVar101,auVar109,5);
          auVar101 = vsqrtps_avx(auVar101);
          auVar229._0_4_ = auVar115._0_4_ + auVar115._0_4_;
          auVar229._4_4_ = auVar115._4_4_ + auVar115._4_4_;
          auVar229._8_4_ = auVar115._8_4_ + auVar115._8_4_;
          auVar229._12_4_ = auVar115._12_4_ + auVar115._12_4_;
          auVar229._16_4_ = auVar115._16_4_ + auVar115._16_4_;
          auVar229._20_4_ = auVar115._20_4_ + auVar115._20_4_;
          auVar229._24_4_ = auVar115._24_4_ + auVar115._24_4_;
          auVar229._28_4_ = auVar115._28_4_ + auVar115._28_4_;
          auVar105 = vrcp14ps_avx512vl(auVar229);
          auVar94 = vfnmadd213ps_avx512vl(auVar229,auVar105,auVar111);
          auVar84 = vfmadd132ps_fma(auVar94,auVar105,auVar105);
          auVar20._8_4_ = 0x80000000;
          auVar20._0_8_ = 0x8000000080000000;
          auVar20._12_4_ = 0x80000000;
          auVar20._16_4_ = 0x80000000;
          auVar20._20_4_ = 0x80000000;
          auVar20._24_4_ = 0x80000000;
          auVar20._28_4_ = 0x80000000;
          auVar105 = vxorps_avx512vl(auVar112,auVar20);
          auVar105 = vsubps_avx(auVar105,auVar101);
          auVar54._4_4_ = auVar105._4_4_ * auVar84._4_4_;
          auVar54._0_4_ = auVar105._0_4_ * auVar84._0_4_;
          auVar54._8_4_ = auVar105._8_4_ * auVar84._8_4_;
          auVar54._12_4_ = auVar105._12_4_ * auVar84._12_4_;
          auVar54._16_4_ = auVar105._16_4_ * 0.0;
          auVar54._20_4_ = auVar105._20_4_ * 0.0;
          auVar54._24_4_ = auVar105._24_4_ * 0.0;
          auVar54._28_4_ = 0x3e000000;
          auVar256 = ZEXT3264(auVar54);
          auVar101 = vsubps_avx512vl(auVar101,auVar112);
          auVar55._4_4_ = auVar101._4_4_ * auVar84._4_4_;
          auVar55._0_4_ = auVar101._0_4_ * auVar84._0_4_;
          auVar55._8_4_ = auVar101._8_4_ * auVar84._8_4_;
          auVar55._12_4_ = auVar101._12_4_ * auVar84._12_4_;
          auVar55._16_4_ = auVar101._16_4_ * 0.0;
          auVar55._20_4_ = auVar101._20_4_ * 0.0;
          auVar55._24_4_ = auVar101._24_4_ * 0.0;
          auVar55._28_4_ = fVar192;
          auVar258 = ZEXT3264(auVar55);
          auVar101 = vfmadd213ps_avx512vl(auVar114,auVar54,auVar107);
          auVar56._4_4_ = auVar96._4_4_ * auVar101._4_4_;
          auVar56._0_4_ = auVar96._0_4_ * auVar101._0_4_;
          auVar56._8_4_ = auVar96._8_4_ * auVar101._8_4_;
          auVar56._12_4_ = auVar96._12_4_ * auVar101._12_4_;
          auVar56._16_4_ = auVar96._16_4_ * auVar101._16_4_;
          auVar56._20_4_ = auVar96._20_4_ * auVar101._20_4_;
          auVar56._24_4_ = auVar96._24_4_ * auVar101._24_4_;
          auVar56._28_4_ = auVar105._28_4_;
          auVar101 = vmulps_avx512vl(local_4a0,auVar54);
          auVar105 = vmulps_avx512vl(local_4c0,auVar54);
          auVar94 = vmulps_avx512vl(local_4e0,auVar54);
          auVar95 = vfmadd213ps_avx512vl(auVar98,auVar56,auVar102);
          auVar101 = vsubps_avx512vl(auVar101,auVar95);
          auVar95 = vfmadd213ps_avx512vl(auVar99,auVar56,auVar103);
          auVar105 = vsubps_avx512vl(auVar105,auVar95);
          auVar84 = vfmadd213ps_fma(auVar56,auVar100,auVar104);
          auVar94 = vsubps_avx(auVar94,ZEXT1632(auVar84));
          auVar243 = ZEXT3264(auVar94);
          auVar94 = vfmadd213ps_avx512vl(auVar114,auVar55,auVar107);
          auVar94 = vmulps_avx512vl(auVar96,auVar94);
          auVar96 = vmulps_avx512vl(local_4a0,auVar55);
          auVar95 = vmulps_avx512vl(local_4c0,auVar55);
          auVar106 = vmulps_avx512vl(local_4e0,auVar55);
          auVar84 = vfmadd213ps_fma(auVar98,auVar94,auVar102);
          auVar96 = vsubps_avx(auVar96,ZEXT1632(auVar84));
          auVar249 = ZEXT3264(auVar96);
          auVar84 = vfmadd213ps_fma(auVar99,auVar94,auVar103);
          auVar96 = vsubps_avx512vl(auVar95,ZEXT1632(auVar84));
          auVar84 = vfmadd213ps_fma(auVar100,auVar94,auVar104);
          auVar98 = vsubps_avx512vl(auVar106,ZEXT1632(auVar84));
          auVar158._8_4_ = 0x7f800000;
          auVar158._0_8_ = 0x7f8000007f800000;
          auVar158._12_4_ = 0x7f800000;
          auVar158._16_4_ = 0x7f800000;
          auVar158._20_4_ = 0x7f800000;
          auVar158._24_4_ = 0x7f800000;
          auVar158._28_4_ = 0x7f800000;
          auVar99 = vblendmps_avx512vl(auVar158,auVar54);
          bVar78 = (bool)((byte)uVar80 & 1);
          auVar130._0_4_ = (uint)bVar78 * auVar99._0_4_ | (uint)!bVar78 * auVar102._0_4_;
          bVar78 = (bool)((byte)(uVar80 >> 1) & 1);
          auVar130._4_4_ = (uint)bVar78 * auVar99._4_4_ | (uint)!bVar78 * auVar102._4_4_;
          bVar78 = (bool)((byte)(uVar80 >> 2) & 1);
          auVar130._8_4_ = (uint)bVar78 * auVar99._8_4_ | (uint)!bVar78 * auVar102._8_4_;
          bVar78 = (bool)((byte)(uVar80 >> 3) & 1);
          auVar130._12_4_ = (uint)bVar78 * auVar99._12_4_ | (uint)!bVar78 * auVar102._12_4_;
          bVar78 = (bool)((byte)(uVar80 >> 4) & 1);
          auVar130._16_4_ = (uint)bVar78 * auVar99._16_4_ | (uint)!bVar78 * auVar102._16_4_;
          bVar78 = (bool)((byte)(uVar80 >> 5) & 1);
          auVar130._20_4_ = (uint)bVar78 * auVar99._20_4_ | (uint)!bVar78 * auVar102._20_4_;
          bVar78 = (bool)((byte)(uVar80 >> 6) & 1);
          auVar130._24_4_ = (uint)bVar78 * auVar99._24_4_ | (uint)!bVar78 * auVar102._24_4_;
          bVar78 = SUB81(uVar80 >> 7,0);
          auVar130._28_4_ = (uint)bVar78 * auVar99._28_4_ | (uint)!bVar78 * auVar102._28_4_;
          auVar159._8_4_ = 0xff800000;
          auVar159._0_8_ = 0xff800000ff800000;
          auVar159._12_4_ = 0xff800000;
          auVar159._16_4_ = 0xff800000;
          auVar159._20_4_ = 0xff800000;
          auVar159._24_4_ = 0xff800000;
          auVar159._28_4_ = 0xff800000;
          auVar99 = vblendmps_avx512vl(auVar159,auVar55);
          bVar78 = (bool)((byte)uVar80 & 1);
          auVar131._0_4_ = (uint)bVar78 * auVar99._0_4_ | (uint)!bVar78 * -0x800000;
          bVar78 = (bool)((byte)(uVar80 >> 1) & 1);
          auVar131._4_4_ = (uint)bVar78 * auVar99._4_4_ | (uint)!bVar78 * -0x800000;
          bVar78 = (bool)((byte)(uVar80 >> 2) & 1);
          auVar131._8_4_ = (uint)bVar78 * auVar99._8_4_ | (uint)!bVar78 * -0x800000;
          bVar78 = (bool)((byte)(uVar80 >> 3) & 1);
          auVar131._12_4_ = (uint)bVar78 * auVar99._12_4_ | (uint)!bVar78 * -0x800000;
          bVar78 = (bool)((byte)(uVar80 >> 4) & 1);
          auVar131._16_4_ = (uint)bVar78 * auVar99._16_4_ | (uint)!bVar78 * -0x800000;
          bVar78 = (bool)((byte)(uVar80 >> 5) & 1);
          auVar131._20_4_ = (uint)bVar78 * auVar99._20_4_ | (uint)!bVar78 * -0x800000;
          bVar78 = (bool)((byte)(uVar80 >> 6) & 1);
          auVar131._24_4_ = (uint)bVar78 * auVar99._24_4_ | (uint)!bVar78 * -0x800000;
          bVar78 = SUB81(uVar80 >> 7,0);
          auVar131._28_4_ = (uint)bVar78 * auVar99._28_4_ | (uint)!bVar78 * -0x800000;
          vandps_avx512vl(auVar110,local_8c0);
          auVar99 = vmaxps_avx(local_500,auVar131);
          auVar21._8_4_ = 0x36000000;
          auVar21._0_8_ = 0x3600000036000000;
          auVar21._12_4_ = 0x36000000;
          auVar21._16_4_ = 0x36000000;
          auVar21._20_4_ = 0x36000000;
          auVar21._24_4_ = 0x36000000;
          auVar21._28_4_ = 0x36000000;
          auVar99 = vmulps_avx512vl(auVar99,auVar21);
          vandps_avx512vl(auVar115,auVar110);
          uVar74 = vcmpps_avx512vl(auVar99,auVar99,1);
          uVar80 = uVar80 & uVar74;
          bVar71 = (byte)uVar80;
          if (bVar71 != 0) {
            uVar74 = vcmpps_avx512vl(auVar97,ZEXT1632(auVar85),2);
            auVar240._8_4_ = 0xff800000;
            auVar240._0_8_ = 0xff800000ff800000;
            auVar240._12_4_ = 0xff800000;
            auVar240._16_4_ = 0xff800000;
            auVar240._20_4_ = 0xff800000;
            auVar240._24_4_ = 0xff800000;
            auVar240._28_4_ = 0xff800000;
            auVar250._8_4_ = 0x7f800000;
            auVar250._0_8_ = 0x7f8000007f800000;
            auVar250._12_4_ = 0x7f800000;
            auVar250._16_4_ = 0x7f800000;
            auVar250._20_4_ = 0x7f800000;
            auVar250._24_4_ = 0x7f800000;
            auVar250._28_4_ = 0x7f800000;
            auVar251 = ZEXT3264(auVar250);
            auVar97 = vblendmps_avx512vl(auVar250,auVar240);
            bVar70 = (byte)uVar74;
            uVar81 = (uint)(bVar70 & 1) * auVar97._0_4_ | (uint)!(bool)(bVar70 & 1) * auVar99._0_4_;
            bVar78 = (bool)((byte)(uVar74 >> 1) & 1);
            uVar140 = (uint)bVar78 * auVar97._4_4_ | (uint)!bVar78 * auVar99._4_4_;
            bVar78 = (bool)((byte)(uVar74 >> 2) & 1);
            uVar141 = (uint)bVar78 * auVar97._8_4_ | (uint)!bVar78 * auVar99._8_4_;
            bVar78 = (bool)((byte)(uVar74 >> 3) & 1);
            uVar142 = (uint)bVar78 * auVar97._12_4_ | (uint)!bVar78 * auVar99._12_4_;
            bVar78 = (bool)((byte)(uVar74 >> 4) & 1);
            uVar143 = (uint)bVar78 * auVar97._16_4_ | (uint)!bVar78 * auVar99._16_4_;
            bVar78 = (bool)((byte)(uVar74 >> 5) & 1);
            uVar144 = (uint)bVar78 * auVar97._20_4_ | (uint)!bVar78 * auVar99._20_4_;
            bVar78 = (bool)((byte)(uVar74 >> 6) & 1);
            uVar145 = (uint)bVar78 * auVar97._24_4_ | (uint)!bVar78 * auVar99._24_4_;
            bVar78 = SUB81(uVar74 >> 7,0);
            uVar146 = (uint)bVar78 * auVar97._28_4_ | (uint)!bVar78 * auVar99._28_4_;
            auVar130._0_4_ = (bVar71 & 1) * uVar81 | !(bool)(bVar71 & 1) * auVar130._0_4_;
            bVar78 = (bool)((byte)(uVar80 >> 1) & 1);
            auVar130._4_4_ = bVar78 * uVar140 | !bVar78 * auVar130._4_4_;
            bVar78 = (bool)((byte)(uVar80 >> 2) & 1);
            auVar130._8_4_ = bVar78 * uVar141 | !bVar78 * auVar130._8_4_;
            bVar78 = (bool)((byte)(uVar80 >> 3) & 1);
            auVar130._12_4_ = bVar78 * uVar142 | !bVar78 * auVar130._12_4_;
            bVar78 = (bool)((byte)(uVar80 >> 4) & 1);
            auVar130._16_4_ = bVar78 * uVar143 | !bVar78 * auVar130._16_4_;
            bVar78 = (bool)((byte)(uVar80 >> 5) & 1);
            auVar130._20_4_ = bVar78 * uVar144 | !bVar78 * auVar130._20_4_;
            bVar78 = (bool)((byte)(uVar80 >> 6) & 1);
            auVar130._24_4_ = bVar78 * uVar145 | !bVar78 * auVar130._24_4_;
            bVar78 = SUB81(uVar80 >> 7,0);
            auVar130._28_4_ = bVar78 * uVar146 | !bVar78 * auVar130._28_4_;
            auVar97 = vblendmps_avx512vl(auVar240,auVar250);
            bVar78 = (bool)((byte)(uVar74 >> 1) & 1);
            bVar6 = (bool)((byte)(uVar74 >> 2) & 1);
            bVar7 = (bool)((byte)(uVar74 >> 3) & 1);
            bVar8 = (bool)((byte)(uVar74 >> 4) & 1);
            bVar9 = (bool)((byte)(uVar74 >> 5) & 1);
            bVar10 = (bool)((byte)(uVar74 >> 6) & 1);
            bVar11 = SUB81(uVar74 >> 7,0);
            auVar131._0_4_ =
                 (uint)(bVar71 & 1) *
                 ((uint)(bVar70 & 1) * auVar97._0_4_ | !(bool)(bVar70 & 1) * uVar81) |
                 !(bool)(bVar71 & 1) * auVar131._0_4_;
            bVar5 = (bool)((byte)(uVar80 >> 1) & 1);
            auVar131._4_4_ =
                 (uint)bVar5 * ((uint)bVar78 * auVar97._4_4_ | !bVar78 * uVar140) |
                 !bVar5 * auVar131._4_4_;
            bVar78 = (bool)((byte)(uVar80 >> 2) & 1);
            auVar131._8_4_ =
                 (uint)bVar78 * ((uint)bVar6 * auVar97._8_4_ | !bVar6 * uVar141) |
                 !bVar78 * auVar131._8_4_;
            bVar78 = (bool)((byte)(uVar80 >> 3) & 1);
            auVar131._12_4_ =
                 (uint)bVar78 * ((uint)bVar7 * auVar97._12_4_ | !bVar7 * uVar142) |
                 !bVar78 * auVar131._12_4_;
            bVar78 = (bool)((byte)(uVar80 >> 4) & 1);
            auVar131._16_4_ =
                 (uint)bVar78 * ((uint)bVar8 * auVar97._16_4_ | !bVar8 * uVar143) |
                 !bVar78 * auVar131._16_4_;
            bVar78 = (bool)((byte)(uVar80 >> 5) & 1);
            auVar131._20_4_ =
                 (uint)bVar78 * ((uint)bVar9 * auVar97._20_4_ | !bVar9 * uVar144) |
                 !bVar78 * auVar131._20_4_;
            bVar78 = (bool)((byte)(uVar80 >> 6) & 1);
            auVar131._24_4_ =
                 (uint)bVar78 * ((uint)bVar10 * auVar97._24_4_ | !bVar10 * uVar145) |
                 !bVar78 * auVar131._24_4_;
            bVar78 = SUB81(uVar80 >> 7,0);
            auVar131._28_4_ =
                 (uint)bVar78 * ((uint)bVar11 * auVar97._28_4_ | !bVar11 * uVar146) |
                 !bVar78 * auVar131._28_4_;
            bVar76 = (~bVar71 | bVar70) & bVar76;
          }
        }
        auVar97 = vmulps_avx512vl(local_4e0,auVar98);
        auVar97 = vfmadd231ps_avx512vl(auVar97,local_4c0,auVar96);
        auVar97 = vfmadd231ps_avx512vl(auVar97,local_4a0,auVar249._0_32_);
        _local_1c0 = _local_6c0;
        local_1a0 = vminps_avx(local_460,auVar130);
        vandps_avx512vl(auVar97,auVar110);
        _local_480 = vmaxps_avx(_local_6c0,auVar131);
        auVar233 = ZEXT3264(_local_480);
        auVar160._8_4_ = 0x3e99999a;
        auVar160._0_8_ = 0x3e99999a3e99999a;
        auVar160._12_4_ = 0x3e99999a;
        auVar160._16_4_ = 0x3e99999a;
        auVar160._20_4_ = 0x3e99999a;
        auVar160._24_4_ = 0x3e99999a;
        auVar160._28_4_ = 0x3e99999a;
        uVar12 = vcmpps_avx512vl(auVar97,auVar160,1);
        local_8cc = (undefined4)uVar12;
        uVar12 = vcmpps_avx512vl(_local_6c0,local_1a0,2);
        bVar71 = (byte)uVar12 & bVar69;
        _local_5a0 = _local_480;
        uVar13 = vcmpps_avx512vl(_local_480,local_460,2);
        if ((bVar69 & ((byte)uVar13 | (byte)uVar12)) == 0) {
          auVar220 = ZEXT3264(CONCAT428(0x3f800000,
                                        CONCAT424(0x3f800000,
                                                  CONCAT420(0x3f800000,
                                                            CONCAT416(0x3f800000,
                                                                      CONCAT412(0x3f800000,
                                                                                CONCAT48(0x3f800000,
                                                                                         &
                                                  DAT_3f8000003f800000)))))));
          auVar207 = ZEXT1664(local_890);
        }
        else {
          auVar97 = vmulps_avx512vl(local_4e0,auVar243._0_32_);
          auVar97 = vfmadd213ps_avx512vl(auVar105,local_4c0,auVar97);
          auVar97 = vfmadd213ps_avx512vl(auVar101,local_4a0,auVar97);
          vandps_avx512vl(auVar97,auVar110);
          uVar12 = vcmpps_avx512vl(auVar97,auVar160,1);
          local_8d4 = (uint)(byte)~bVar76;
          bVar76 = (byte)uVar12 | ~bVar76;
          auVar161._8_4_ = 2;
          auVar161._0_8_ = 0x200000002;
          auVar161._12_4_ = 2;
          auVar161._16_4_ = 2;
          auVar161._20_4_ = 2;
          auVar161._24_4_ = 2;
          auVar161._28_4_ = 2;
          auVar22._8_4_ = 3;
          auVar22._0_8_ = 0x300000003;
          auVar22._12_4_ = 3;
          auVar22._16_4_ = 3;
          auVar22._20_4_ = 3;
          auVar22._24_4_ = 3;
          auVar22._28_4_ = 3;
          auVar97 = vpblendmd_avx512vl(auVar161,auVar22);
          local_440._0_4_ = (uint)(bVar76 & 1) * auVar97._0_4_ | (uint)!(bool)(bVar76 & 1) * 2;
          bVar78 = (bool)(bVar76 >> 1 & 1);
          local_440._4_4_ = (uint)bVar78 * auVar97._4_4_ | (uint)!bVar78 * 2;
          bVar78 = (bool)(bVar76 >> 2 & 1);
          local_440._8_4_ = (uint)bVar78 * auVar97._8_4_ | (uint)!bVar78 * 2;
          bVar78 = (bool)(bVar76 >> 3 & 1);
          local_440._12_4_ = (uint)bVar78 * auVar97._12_4_ | (uint)!bVar78 * 2;
          bVar78 = (bool)(bVar76 >> 4 & 1);
          local_440._16_4_ = (uint)bVar78 * auVar97._16_4_ | (uint)!bVar78 * 2;
          bVar78 = (bool)(bVar76 >> 5 & 1);
          local_440._20_4_ = (uint)bVar78 * auVar97._20_4_ | (uint)!bVar78 * 2;
          bVar78 = (bool)(bVar76 >> 6 & 1);
          local_440._24_4_ = (uint)bVar78 * auVar97._24_4_ | (uint)!bVar78 * 2;
          local_440._28_4_ = (uint)(bVar76 >> 7) * auVar97._28_4_ | (uint)!(bool)(bVar76 >> 7) * 2;
          local_520 = vpbroadcastd_avx512vl();
          uVar12 = vpcmpd_avx512vl(local_520,local_440,5);
          local_8d0 = (uint)bVar71;
          bVar71 = (byte)uVar12 & bVar71;
          if (bVar71 == 0) {
            auVar223._8_4_ = 0x7fffffff;
            auVar223._0_8_ = 0x7fffffff7fffffff;
            auVar223._12_4_ = 0x7fffffff;
          }
          else {
            auVar85 = vminps_avx(local_760._0_16_,local_7a0._0_16_);
            auVar84 = vmaxps_avx(local_760._0_16_,local_7a0._0_16_);
            auVar86 = vminps_avx(local_780._0_16_,local_7c0._0_16_);
            auVar1 = vminps_avx(auVar85,auVar86);
            auVar85 = vmaxps_avx(local_780._0_16_,local_7c0._0_16_);
            auVar86 = vmaxps_avx(auVar84,auVar85);
            auVar193._8_4_ = 0x7fffffff;
            auVar193._0_8_ = 0x7fffffff7fffffff;
            auVar193._12_4_ = 0x7fffffff;
            auVar84 = vandps_avx(auVar1,auVar193);
            auVar85 = vandps_avx(auVar86,auVar193);
            auVar84 = vmaxps_avx(auVar84,auVar85);
            auVar85 = vmovshdup_avx(auVar84);
            auVar85 = vmaxss_avx(auVar85,auVar84);
            auVar84 = vshufpd_avx(auVar84,auVar84,1);
            auVar84 = vmaxss_avx(auVar84,auVar85);
            fVar242 = auVar84._0_4_ * 1.9073486e-06;
            local_740 = vshufps_avx(auVar86,auVar86,0xff);
            local_580 = (float)local_6c0._0_4_ + (float)local_5c0._0_4_;
            fStack_57c = (float)local_6c0._4_4_ + (float)local_5c0._4_4_;
            fStack_578 = fStack_6b8 + fStack_5b8;
            fStack_574 = fStack_6b4 + fStack_5b4;
            fStack_570 = fStack_6b0 + fStack_5b0;
            fStack_56c = fStack_6ac + fStack_5ac;
            fStack_568 = fStack_6a8 + fStack_5a8;
            fStack_564 = fStack_6a4 + fStack_5a4;
            do {
              auVar162._8_4_ = 0x7f800000;
              auVar162._0_8_ = 0x7f8000007f800000;
              auVar162._12_4_ = 0x7f800000;
              auVar162._16_4_ = 0x7f800000;
              auVar162._20_4_ = 0x7f800000;
              auVar162._24_4_ = 0x7f800000;
              auVar162._28_4_ = 0x7f800000;
              auVar97 = vblendmps_avx512vl(auVar162,_local_6c0);
              auVar132._0_4_ =
                   (uint)(bVar71 & 1) * auVar97._0_4_ | (uint)!(bool)(bVar71 & 1) * 0x7f800000;
              bVar78 = (bool)(bVar71 >> 1 & 1);
              auVar132._4_4_ = (uint)bVar78 * auVar97._4_4_ | (uint)!bVar78 * 0x7f800000;
              bVar78 = (bool)(bVar71 >> 2 & 1);
              auVar132._8_4_ = (uint)bVar78 * auVar97._8_4_ | (uint)!bVar78 * 0x7f800000;
              bVar78 = (bool)(bVar71 >> 3 & 1);
              auVar132._12_4_ = (uint)bVar78 * auVar97._12_4_ | (uint)!bVar78 * 0x7f800000;
              bVar78 = (bool)(bVar71 >> 4 & 1);
              auVar132._16_4_ = (uint)bVar78 * auVar97._16_4_ | (uint)!bVar78 * 0x7f800000;
              bVar78 = (bool)(bVar71 >> 5 & 1);
              auVar132._20_4_ = (uint)bVar78 * auVar97._20_4_ | (uint)!bVar78 * 0x7f800000;
              auVar132._24_4_ =
                   (uint)(bVar71 >> 6) * auVar97._24_4_ | (uint)!(bool)(bVar71 >> 6) * 0x7f800000;
              auVar132._28_4_ = 0x7f800000;
              auVar97 = vshufps_avx(auVar132,auVar132,0xb1);
              auVar97 = vminps_avx(auVar132,auVar97);
              auVar96 = vshufpd_avx(auVar97,auVar97,5);
              auVar97 = vminps_avx(auVar97,auVar96);
              auVar96 = vpermpd_avx2(auVar97,0x4e);
              auVar97 = vminps_avx(auVar97,auVar96);
              uVar12 = vcmpps_avx512vl(auVar132,auVar97,0);
              bVar70 = (byte)uVar12 & bVar71;
              bVar76 = bVar71;
              if (bVar70 != 0) {
                bVar76 = bVar70;
              }
              iVar15 = 0;
              for (uVar81 = (uint)bVar76; (uVar81 & 1) == 0; uVar81 = uVar81 >> 1 | 0x80000000) {
                iVar15 = iVar15 + 1;
              }
              bVar76 = '\x01' << ((byte)iVar15 & 0x1f);
              uVar81 = *(uint *)(local_540 + (uint)(iVar15 << 2));
              uVar140 = *(uint *)(local_1c0 + (uint)(iVar15 << 2));
              fVar244 = local_8c8;
              if ((float)local_7e0._0_4_ < 0.0) {
                fVar244 = sqrtf((float)local_7e0._0_4_);
              }
              auVar249 = ZEXT464(uVar81);
              auVar241 = ZEXT464(uVar140);
              bVar70 = ~bVar76;
              lVar77 = 5;
              do {
                fVar245 = auVar241._0_4_;
                auVar150._4_4_ = fVar245;
                auVar150._0_4_ = fVar245;
                auVar150._8_4_ = fVar245;
                auVar150._12_4_ = fVar245;
                auVar84 = vfmadd132ps_fma(auVar150,ZEXT816(0) << 0x40,local_7d0);
                fVar248 = auVar249._0_4_;
                fVar232 = 1.0 - fVar248;
                fVar238 = fVar232 * fVar232 * fVar232;
                fVar246 = fVar248 * fVar248;
                fVar231 = fVar248 * fVar246;
                auVar85 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar238),
                                          ZEXT416((uint)fVar231));
                fVar237 = fVar248 * fVar232;
                auVar221 = ZEXT416((uint)fVar232);
                auVar1 = vfmadd231ss_fma(ZEXT416((uint)(fVar248 * fVar237 * 6.0)),
                                         ZEXT416((uint)(fVar237 * fVar232)),
                                         SUB6416(ZEXT464(0x41400000),0));
                auVar86 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar231),
                                          ZEXT416((uint)fVar238));
                auVar82 = vfmadd231ss_fma(ZEXT416((uint)(fVar237 * fVar232 * 6.0)),
                                          SUB6416(ZEXT464(0x41400000),0),
                                          ZEXT416((uint)(fVar248 * fVar237)));
                fVar238 = fVar238 * 0.16666667;
                fVar247 = (auVar85._0_4_ + auVar1._0_4_) * 0.16666667;
                fVar211 = (auVar86._0_4_ + auVar82._0_4_) * 0.16666667;
                fVar231 = fVar231 * 0.16666667;
                auVar194._0_4_ = fVar231 * (float)local_7c0._0_4_;
                auVar194._4_4_ = fVar231 * (float)local_7c0._4_4_;
                auVar194._8_4_ = fVar231 * fStack_7b8;
                auVar194._12_4_ = fVar231 * fStack_7b4;
                auVar222._4_4_ = fVar211;
                auVar222._0_4_ = fVar211;
                auVar222._8_4_ = fVar211;
                auVar222._12_4_ = fVar211;
                auVar85 = vfmadd132ps_fma(auVar222,auVar194,local_780._0_16_);
                auVar195._4_4_ = fVar247;
                auVar195._0_4_ = fVar247;
                auVar195._8_4_ = fVar247;
                auVar195._12_4_ = fVar247;
                auVar85 = vfmadd132ps_fma(auVar195,auVar85,local_7a0._0_16_);
                auVar173._4_4_ = fVar238;
                auVar173._0_4_ = fVar238;
                auVar173._8_4_ = fVar238;
                auVar173._12_4_ = fVar238;
                local_6d0 = vfmadd132ps_fma(auVar173,auVar85,local_760._0_16_);
                auVar84 = vsubps_avx(auVar84,local_6d0);
                local_800._0_16_ = auVar84;
                auVar84 = vdpps_avx(auVar84,auVar84,0x7f);
                auVar85 = auVar249._0_16_;
                local_820._0_16_ = auVar84;
                if (auVar84._0_4_ < 0.0) {
                  local_8c0._0_4_ = fVar246;
                  auVar207._0_4_ = sqrtf(auVar84._0_4_);
                  auVar207._4_60_ = extraout_var;
                  auVar84 = auVar207._0_16_;
                }
                else {
                  auVar84 = vsqrtss_avx(auVar84,auVar84);
                  local_8c0._0_4_ = fVar246;
                }
                auVar1 = vfnmsub213ss_fma(auVar85,auVar85,ZEXT416((uint)(fVar237 * 4.0)));
                auVar86 = vfmadd231ss_fma(ZEXT416((uint)(fVar237 * 4.0)),auVar221,auVar221);
                fVar246 = fVar232 * -fVar232 * 0.5;
                fVar237 = auVar1._0_4_ * 0.5;
                fVar238 = auVar86._0_4_ * 0.5;
                local_8c0._0_4_ = (float)local_8c0._0_4_ * 0.5;
                auVar212._0_4_ = (float)local_8c0._0_4_ * (float)local_7c0._0_4_;
                auVar212._4_4_ = (float)local_8c0._0_4_ * (float)local_7c0._4_4_;
                auVar212._8_4_ = (float)local_8c0._0_4_ * fStack_7b8;
                auVar212._12_4_ = (float)local_8c0._0_4_ * fStack_7b4;
                auVar174._4_4_ = fVar238;
                auVar174._0_4_ = fVar238;
                auVar174._8_4_ = fVar238;
                auVar174._12_4_ = fVar238;
                auVar86 = vfmadd132ps_fma(auVar174,auVar212,local_780._0_16_);
                auVar196._4_4_ = fVar237;
                auVar196._0_4_ = fVar237;
                auVar196._8_4_ = fVar237;
                auVar196._12_4_ = fVar237;
                auVar86 = vfmadd132ps_fma(auVar196,auVar86,local_7a0._0_16_);
                auVar254._4_4_ = fVar246;
                auVar254._0_4_ = fVar246;
                auVar254._8_4_ = fVar246;
                auVar254._12_4_ = fVar246;
                local_8c0._0_16_ = vfmadd132ps_fma(auVar254,auVar86,local_760._0_16_);
                local_6f0 = vdpps_avx(local_8c0._0_16_,local_8c0._0_16_,0x7f);
                auVar58._12_4_ = 0;
                auVar58._0_12_ = ZEXT812(0);
                fVar246 = local_6f0._0_4_;
                auVar86 = vrsqrt14ss_avx512f(auVar58 << 0x20,ZEXT416((uint)fVar246));
                fVar237 = auVar86._0_4_;
                local_700 = vrcp14ss_avx512f(auVar58 << 0x20,ZEXT416((uint)fVar246));
                auVar86 = vfnmadd213ss_fma(local_700,local_6f0,ZEXT416(0x40000000));
                uVar81 = auVar84._0_4_;
                local_6e0 = fVar232;
                fStack_6dc = fVar232;
                fStack_6d8 = fVar232;
                fStack_6d4 = fVar232;
                if (fVar246 < -fVar246) {
                  fVar238 = sqrtf(fVar246);
                  auVar84 = ZEXT416(uVar81);
                  auVar1 = local_8c0._0_16_;
                }
                else {
                  auVar1 = vsqrtss_avx(local_6f0,local_6f0);
                  fVar238 = auVar1._0_4_;
                  auVar1 = local_8c0._0_16_;
                }
                fVar246 = fVar237 * 1.5 + fVar246 * -0.5 * fVar237 * fVar237 * fVar237;
                auVar151._0_4_ = auVar1._0_4_ * fVar246;
                auVar151._4_4_ = auVar1._4_4_ * fVar246;
                auVar151._8_4_ = auVar1._8_4_ * fVar246;
                auVar151._12_4_ = auVar1._12_4_ * fVar246;
                auVar82 = vdpps_avx(local_800._0_16_,auVar151,0x7f);
                fVar211 = auVar84._0_4_;
                fVar237 = auVar82._0_4_;
                auVar152._0_4_ = fVar237 * fVar237;
                auVar152._4_4_ = auVar82._4_4_ * auVar82._4_4_;
                auVar152._8_4_ = auVar82._8_4_ * auVar82._8_4_;
                auVar152._12_4_ = auVar82._12_4_ * auVar82._12_4_;
                auVar83 = vsubps_avx512vl(local_820._0_16_,auVar152);
                fVar247 = auVar83._0_4_;
                auVar175._4_12_ = ZEXT812(0) << 0x20;
                auVar175._0_4_ = fVar247;
                auVar87 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar175);
                auVar88 = vmulss_avx512f(auVar87,ZEXT416(0x3fc00000));
                auVar89 = vmulss_avx512f(auVar83,ZEXT416(0xbf000000));
                if (fVar247 < 0.0) {
                  local_720 = fVar246;
                  fStack_71c = fVar246;
                  fStack_718 = fVar246;
                  fStack_714 = fVar246;
                  local_710 = auVar87;
                  fVar247 = sqrtf(fVar247);
                  auVar89 = ZEXT416(auVar89._0_4_);
                  auVar88 = ZEXT416(auVar88._0_4_);
                  auVar84 = ZEXT416(uVar81);
                  auVar1 = local_8c0._0_16_;
                  auVar87 = local_710;
                  fVar246 = local_720;
                  fVar231 = fStack_71c;
                  fVar232 = fStack_718;
                  fVar239 = fStack_714;
                }
                else {
                  auVar83 = vsqrtss_avx(auVar83,auVar83);
                  fVar247 = auVar83._0_4_;
                  fVar231 = fVar246;
                  fVar232 = fVar246;
                  fVar239 = fVar246;
                }
                auVar256 = ZEXT1664(auVar1);
                auVar243 = ZEXT1664(local_800._0_16_);
                auVar97 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                auVar260 = ZEXT3264(auVar97);
                auVar83 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),auVar221,auVar85);
                auVar85 = vfmadd231ss_fma(auVar221,auVar85,SUB6416(ZEXT464(0xc0000000),0));
                auVar197._0_4_ = fVar248 * (float)local_7c0._0_4_;
                auVar197._4_4_ = fVar248 * (float)local_7c0._4_4_;
                auVar197._8_4_ = fVar248 * fStack_7b8;
                auVar197._12_4_ = fVar248 * fStack_7b4;
                auVar213._0_4_ = auVar85._0_4_;
                auVar213._4_4_ = auVar213._0_4_;
                auVar213._8_4_ = auVar213._0_4_;
                auVar213._12_4_ = auVar213._0_4_;
                auVar85 = vfmadd132ps_fma(auVar213,auVar197,local_780._0_16_);
                auVar176._0_4_ = auVar83._0_4_;
                auVar176._4_4_ = auVar176._0_4_;
                auVar176._8_4_ = auVar176._0_4_;
                auVar176._12_4_ = auVar176._0_4_;
                auVar85 = vfmadd132ps_fma(auVar176,auVar85,local_7a0._0_16_);
                auVar64._4_4_ = fStack_6dc;
                auVar64._0_4_ = local_6e0;
                auVar64._8_4_ = fStack_6d8;
                auVar64._12_4_ = fStack_6d4;
                auVar85 = vfmadd132ps_fma(auVar64,auVar85,local_760._0_16_);
                auVar177._0_4_ = auVar85._0_4_ * (float)local_6f0._0_4_;
                auVar177._4_4_ = auVar85._4_4_ * (float)local_6f0._0_4_;
                auVar177._8_4_ = auVar85._8_4_ * (float)local_6f0._0_4_;
                auVar177._12_4_ = auVar85._12_4_ * (float)local_6f0._0_4_;
                auVar85 = vdpps_avx(auVar1,auVar85,0x7f);
                fVar192 = auVar85._0_4_;
                auVar198._0_4_ = auVar1._0_4_ * fVar192;
                auVar198._4_4_ = auVar1._4_4_ * fVar192;
                auVar198._8_4_ = auVar1._8_4_ * fVar192;
                auVar198._12_4_ = auVar1._12_4_ * fVar192;
                auVar85 = vsubps_avx(auVar177,auVar198);
                fVar192 = auVar86._0_4_ * (float)local_700._0_4_;
                auVar221 = vmaxss_avx(ZEXT416((uint)fVar242),
                                      ZEXT416((uint)(fVar245 * fVar244 * 1.9073486e-06)));
                auVar16._8_4_ = 0x80000000;
                auVar16._0_8_ = 0x8000000080000000;
                auVar16._12_4_ = 0x80000000;
                auVar134._16_16_ = auVar97._16_16_;
                auVar90 = vxorps_avx512vl(auVar1,auVar16);
                auVar199._0_4_ = fVar246 * auVar85._0_4_ * fVar192;
                auVar199._4_4_ = fVar231 * auVar85._4_4_ * fVar192;
                auVar199._8_4_ = fVar232 * auVar85._8_4_ * fVar192;
                auVar199._12_4_ = fVar239 * auVar85._12_4_ * fVar192;
                auVar251 = ZEXT1664(auVar151);
                auVar85 = vdpps_avx(auVar90,auVar151,0x7f);
                auVar86 = vfmadd213ss_fma(auVar84,ZEXT416((uint)fVar242),auVar221);
                auVar84 = vdpps_avx(local_800._0_16_,auVar199,0x7f);
                auVar83 = vfmadd213ss_fma(ZEXT416((uint)(fVar211 + 1.0)),
                                          ZEXT416((uint)(fVar242 / fVar238)),auVar86);
                auVar258 = ZEXT1664(auVar83);
                fVar246 = auVar85._0_4_ + auVar84._0_4_;
                auVar84 = vdpps_avx(local_7d0,auVar151,0x7f);
                auVar85 = vdpps_avx(local_800._0_16_,auVar90,0x7f);
                auVar86 = vmulss_avx512f(auVar89,auVar87);
                auVar89 = vaddss_avx512f(auVar88,ZEXT416((uint)(auVar86._0_4_ *
                                                               auVar87._0_4_ * auVar87._0_4_)));
                auVar86 = vdpps_avx(local_800._0_16_,local_7d0,0x7f);
                auVar87 = vfnmadd231ss_fma(auVar85,auVar82,ZEXT416((uint)fVar246));
                auVar88 = vfnmadd231ss_fma(auVar86,auVar82,auVar84);
                auVar85 = vpermilps_avx(local_6d0,0xff);
                fVar247 = fVar247 - auVar85._0_4_;
                auVar85 = vshufps_avx(auVar1,auVar1,0xff);
                auVar86 = vfmsub213ss_fma(auVar87,auVar89,auVar85);
                fVar238 = auVar88._0_4_ * auVar89._0_4_;
                auVar87 = vfmsub231ss_fma(ZEXT416((uint)(auVar84._0_4_ * auVar86._0_4_)),
                                          ZEXT416((uint)fVar246),ZEXT416((uint)fVar238));
                fVar211 = auVar87._0_4_;
                fVar238 = fVar237 * (fVar238 / fVar211) - fVar247 * (auVar84._0_4_ / fVar211);
                auVar233 = ZEXT464((uint)fVar238);
                fVar248 = fVar248 - fVar238;
                auVar249 = ZEXT464((uint)fVar248);
                fVar245 = fVar245 - (fVar247 * (fVar246 / fVar211) -
                                    fVar237 * (auVar86._0_4_ / fVar211));
                auVar241 = ZEXT464((uint)fVar245);
                auVar223._8_4_ = 0x7fffffff;
                auVar223._0_8_ = 0x7fffffff7fffffff;
                auVar223._12_4_ = 0x7fffffff;
                auVar84 = vandps_avx(auVar82,auVar223);
                bVar78 = true;
                if (auVar84._0_4_ < auVar83._0_4_) {
                  auVar86 = vfmadd231ss_fma(ZEXT416((uint)(auVar83._0_4_ + auVar221._0_4_)),
                                            local_740,ZEXT416(0x36000000));
                  auVar84 = vandps_avx(ZEXT416((uint)fVar247),auVar223);
                  if (auVar84._0_4_ < auVar86._0_4_) {
                    fVar245 = fVar245 + (float)local_730._0_4_;
                    auVar241 = ZEXT464((uint)fVar245);
                    if (fVar147 <= fVar245) {
                      fVar246 = *(float *)(ray + k * 4 + 0x80);
                      auVar233 = ZEXT464((uint)fVar246);
                      if (((fVar245 <= fVar246) && (0.0 <= fVar248)) && (fVar248 <= 1.0)) {
                        auVar134._0_16_ = ZEXT816(0) << 0x20;
                        auVar133._4_28_ = auVar134._4_28_;
                        auVar133._0_4_ = local_820._0_4_;
                        auVar84 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x20,auVar133._0_16_);
                        fVar237 = auVar84._0_4_;
                        auVar84 = vmulss_avx512f(local_820._0_16_,ZEXT416(0xbf000000));
                        pGVar3 = (context->scene->geometries).items[local_858].ptr;
                        if ((pGVar3->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                          if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                             (pGVar3->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
                            bVar76 = true;
                          }
                          else {
                            fVar237 = fVar237 * 1.5 + auVar84._0_4_ * fVar237 * fVar237 * fVar237;
                            auVar178._0_4_ = local_800._0_4_ * fVar237;
                            auVar178._4_4_ = local_800._4_4_ * fVar237;
                            auVar178._8_4_ = local_800._8_4_ * fVar237;
                            auVar178._12_4_ = local_800._12_4_ * fVar237;
                            auVar82 = vfmadd213ps_fma(auVar85,auVar178,auVar1);
                            auVar84 = vshufps_avx(auVar178,auVar178,0xc9);
                            auVar85 = vshufps_avx(auVar1,auVar1,0xc9);
                            auVar179._0_4_ = auVar178._0_4_ * auVar85._0_4_;
                            auVar179._4_4_ = auVar178._4_4_ * auVar85._4_4_;
                            auVar179._8_4_ = auVar178._8_4_ * auVar85._8_4_;
                            auVar179._12_4_ = auVar178._12_4_ * auVar85._12_4_;
                            auVar86 = vfmsub231ps_fma(auVar179,auVar1,auVar84);
                            auVar84 = vshufps_avx(auVar86,auVar86,0xc9);
                            auVar85 = vshufps_avx(auVar82,auVar82,0xc9);
                            auVar86 = vshufps_avx(auVar86,auVar86,0xd2);
                            auVar153._0_4_ = auVar82._0_4_ * auVar86._0_4_;
                            auVar153._4_4_ = auVar82._4_4_ * auVar86._4_4_;
                            auVar153._8_4_ = auVar82._8_4_ * auVar86._8_4_;
                            auVar153._12_4_ = auVar82._12_4_ * auVar86._12_4_;
                            auVar84 = vfmsub231ps_fma(auVar153,auVar84,auVar85);
                            local_660 = (RTCHitN  [16])vshufps_avx(auVar84,auVar84,0x55);
                            auStack_650 = vshufps_avx(auVar84,auVar84,0xaa);
                            local_640 = auVar84._0_4_;
                            uStack_63c = local_640;
                            uStack_638 = local_640;
                            uStack_634 = local_640;
                            local_630 = fVar248;
                            fStack_62c = fVar248;
                            fStack_628 = fVar248;
                            fStack_624 = fVar248;
                            local_620 = ZEXT416(0) << 0x20;
                            local_610 = local_670._0_8_;
                            uStack_608 = local_670._8_8_;
                            local_600 = local_680;
                            vpcmpeqd_avx2(ZEXT1632(local_680),ZEXT1632(local_680));
                            uStack_5ec = context->user->instID[0];
                            local_5f0 = uStack_5ec;
                            uStack_5e8 = uStack_5ec;
                            uStack_5e4 = uStack_5ec;
                            uStack_5e0 = context->user->instPrimID[0];
                            uStack_5dc = uStack_5e0;
                            uStack_5d8 = uStack_5e0;
                            uStack_5d4 = uStack_5e0;
                            *(float *)(ray + k * 4 + 0x80) = fVar245;
                            local_8f0 = local_690._0_8_;
                            uStack_8e8 = local_690._8_8_;
                            local_850.valid = (int *)&local_8f0;
                            local_850.geometryUserPtr = pGVar3->userPtr;
                            local_850.context = context->user;
                            local_850.hit = local_660;
                            local_850.N = 4;
                            local_850.ray = (RTCRayN *)ray;
                            if (pGVar3->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                              auVar243 = ZEXT1664(local_800._0_16_);
                              auVar251 = ZEXT1664(auVar151);
                              auVar256 = ZEXT1664(auVar1);
                              auVar258 = ZEXT1664(auVar83);
                              (*pGVar3->occlusionFilterN)(&local_850);
                              auVar241 = ZEXT1664(ZEXT416((uint)fVar245));
                              auVar249 = ZEXT1664(ZEXT416((uint)fVar248));
                              auVar223._8_4_ = 0x7fffffff;
                              auVar223._0_8_ = 0x7fffffff7fffffff;
                              auVar223._12_4_ = 0x7fffffff;
                              auVar97 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                              auVar260 = ZEXT3264(auVar97);
                            }
                            auVar60._8_8_ = uStack_8e8;
                            auVar60._0_8_ = local_8f0;
                            uVar80 = vptestmd_avx512vl(auVar60,auVar60);
                            if ((uVar80 & 0xf) == 0) {
                              bVar76 = false;
                            }
                            else {
                              p_Var4 = context->args->filter;
                              if ((p_Var4 != (RTCFilterFunctionN)0x0) &&
                                 (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER
                                   ) != RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                  (((pGVar3->field_8).field_0x2 & 0x40) != 0)))) {
                                auVar243 = ZEXT1664(auVar243._0_16_);
                                auVar251 = ZEXT1664(auVar251._0_16_);
                                auVar256 = ZEXT1664(auVar256._0_16_);
                                auVar258 = ZEXT1664(auVar258._0_16_);
                                (*p_Var4)(&local_850);
                                auVar241 = ZEXT1664(ZEXT416((uint)fVar245));
                                auVar249 = ZEXT1664(ZEXT416((uint)fVar248));
                                auVar223._8_4_ = 0x7fffffff;
                                auVar223._0_8_ = 0x7fffffff7fffffff;
                                auVar223._12_4_ = 0x7fffffff;
                                auVar97 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                                auVar260 = ZEXT3264(auVar97);
                              }
                              auVar61._8_8_ = uStack_8e8;
                              auVar61._0_8_ = local_8f0;
                              uVar80 = vptestmd_avx512vl(auVar61,auVar61);
                              uVar80 = uVar80 & 0xf;
                              auVar84 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                              bVar78 = (bool)((byte)uVar80 & 1);
                              bVar5 = (bool)((byte)(uVar80 >> 1) & 1);
                              bVar6 = (bool)((byte)(uVar80 >> 2) & 1);
                              bVar7 = SUB81(uVar80 >> 3,0);
                              *(uint *)(local_850.ray + 0x80) =
                                   (uint)bVar78 * auVar84._0_4_ |
                                   (uint)!bVar78 * *(int *)(local_850.ray + 0x80);
                              *(uint *)(local_850.ray + 0x84) =
                                   (uint)bVar5 * auVar84._4_4_ |
                                   (uint)!bVar5 * *(int *)(local_850.ray + 0x84);
                              *(uint *)(local_850.ray + 0x88) =
                                   (uint)bVar6 * auVar84._8_4_ |
                                   (uint)!bVar6 * *(int *)(local_850.ray + 0x88);
                              *(uint *)(local_850.ray + 0x8c) =
                                   (uint)bVar7 * auVar84._12_4_ |
                                   (uint)!bVar7 * *(int *)(local_850.ray + 0x8c);
                              bVar76 = (byte)uVar80 != 0;
                            }
                            if ((bool)bVar76 == false) {
                              *(float *)(ray + k * 4 + 0x80) = fVar246;
                            }
                          }
                          auVar233 = ZEXT464((uint)fVar246);
                          bVar78 = false;
                          goto LAB_01d41465;
                        }
                      }
                    }
                    bVar78 = false;
                    bVar76 = 0;
                  }
                }
LAB_01d41465:
                if (!bVar78) goto LAB_01d4178d;
                lVar77 = lVar77 + -1;
              } while (lVar77 != 0);
              bVar76 = 0;
LAB_01d4178d:
              bVar73 = bVar73 | bVar76 & 1;
              auVar66._4_4_ = fStack_57c;
              auVar66._0_4_ = local_580;
              auVar66._8_4_ = fStack_578;
              auVar66._12_4_ = fStack_574;
              auVar66._16_4_ = fStack_570;
              auVar66._20_4_ = fStack_56c;
              auVar66._24_4_ = fStack_568;
              auVar66._28_4_ = fStack_564;
              uVar148 = *(undefined4 *)(ray + k * 4 + 0x80);
              auVar23._4_4_ = uVar148;
              auVar23._0_4_ = uVar148;
              auVar23._8_4_ = uVar148;
              auVar23._12_4_ = uVar148;
              auVar23._16_4_ = uVar148;
              auVar23._20_4_ = uVar148;
              auVar23._24_4_ = uVar148;
              auVar23._28_4_ = uVar148;
              uVar12 = vcmpps_avx512vl(auVar66,auVar23,2);
              bVar71 = bVar70 & bVar71 & (byte)uVar12;
            } while (bVar71 != 0);
          }
          auVar163._0_4_ = (float)local_5c0._0_4_ + (float)local_5a0._0_4_;
          auVar163._4_4_ = (float)local_5c0._4_4_ + (float)local_5a0._4_4_;
          auVar163._8_4_ = fStack_5b8 + fStack_598;
          auVar163._12_4_ = fStack_5b4 + fStack_594;
          auVar163._16_4_ = fStack_5b0 + fStack_590;
          auVar163._20_4_ = fStack_5ac + fStack_58c;
          auVar163._24_4_ = fStack_5a8 + fStack_588;
          auVar163._28_4_ = fStack_5a4 + fStack_584;
          uVar148 = *(undefined4 *)(ray + k * 4 + 0x80);
          auVar24._4_4_ = uVar148;
          auVar24._0_4_ = uVar148;
          auVar24._8_4_ = uVar148;
          auVar24._12_4_ = uVar148;
          auVar24._16_4_ = uVar148;
          auVar24._20_4_ = uVar148;
          auVar24._24_4_ = uVar148;
          auVar24._28_4_ = uVar148;
          uVar12 = vcmpps_avx512vl(auVar163,auVar24,2);
          bVar76 = (byte)local_8cc | (byte)local_8d4;
          bVar69 = (byte)uVar13 & bVar69 & (byte)uVar12;
          auVar164._8_4_ = 2;
          auVar164._0_8_ = 0x200000002;
          auVar164._12_4_ = 2;
          auVar164._16_4_ = 2;
          auVar164._20_4_ = 2;
          auVar164._24_4_ = 2;
          auVar164._28_4_ = 2;
          auVar25._8_4_ = 3;
          auVar25._0_8_ = 0x300000003;
          auVar25._12_4_ = 3;
          auVar25._16_4_ = 3;
          auVar25._20_4_ = 3;
          auVar25._24_4_ = 3;
          auVar25._28_4_ = 3;
          auVar97 = vpblendmd_avx512vl(auVar164,auVar25);
          local_5a0._0_4_ = (uint)(bVar76 & 1) * auVar97._0_4_ | (uint)!(bool)(bVar76 & 1) * 2;
          bVar78 = (bool)(bVar76 >> 1 & 1);
          local_5a0._4_4_ = (uint)bVar78 * auVar97._4_4_ | (uint)!bVar78 * 2;
          bVar78 = (bool)(bVar76 >> 2 & 1);
          fStack_598 = (float)((uint)bVar78 * auVar97._8_4_ | (uint)!bVar78 * 2);
          bVar78 = (bool)(bVar76 >> 3 & 1);
          fStack_594 = (float)((uint)bVar78 * auVar97._12_4_ | (uint)!bVar78 * 2);
          bVar78 = (bool)(bVar76 >> 4 & 1);
          fStack_590 = (float)((uint)bVar78 * auVar97._16_4_ | (uint)!bVar78 * 2);
          bVar78 = (bool)(bVar76 >> 5 & 1);
          fStack_58c = (float)((uint)bVar78 * auVar97._20_4_ | (uint)!bVar78 * 2);
          bVar78 = (bool)(bVar76 >> 6 & 1);
          fStack_588 = (float)((uint)bVar78 * auVar97._24_4_ | (uint)!bVar78 * 2);
          fStack_584 = (float)((uint)(bVar76 >> 7) * auVar97._28_4_ | (uint)!(bool)(bVar76 >> 7) * 2
                              );
          uVar12 = vpcmpd_avx512vl(_local_5a0,local_520,2);
          bVar76 = (byte)uVar12 & bVar69;
          if (bVar76 != 0) {
            auVar85 = vminps_avx(local_760._0_16_,local_7a0._0_16_);
            auVar84 = vmaxps_avx(local_760._0_16_,local_7a0._0_16_);
            auVar86 = vminps_avx(local_780._0_16_,local_7c0._0_16_);
            auVar1 = vminps_avx(auVar85,auVar86);
            auVar85 = vmaxps_avx(local_780._0_16_,local_7c0._0_16_);
            auVar86 = vmaxps_avx(auVar84,auVar85);
            auVar84 = vandps_avx(auVar1,auVar223);
            auVar85 = vandps_avx(auVar86,auVar223);
            auVar84 = vmaxps_avx(auVar84,auVar85);
            auVar85 = vmovshdup_avx(auVar84);
            auVar85 = vmaxss_avx(auVar85,auVar84);
            auVar84 = vshufpd_avx(auVar84,auVar84,1);
            auVar84 = vmaxss_avx(auVar84,auVar85);
            fVar242 = auVar84._0_4_ * 1.9073486e-06;
            local_740 = vshufps_avx(auVar86,auVar86,0xff);
            _local_6c0 = _local_480;
            local_580 = (float)local_5c0._0_4_ + (float)local_480._0_4_;
            fStack_57c = (float)local_5c0._4_4_ + (float)local_480._4_4_;
            fStack_578 = fStack_5b8 + fStack_478;
            fStack_574 = fStack_5b4 + fStack_474;
            fStack_570 = fStack_5b0 + fStack_470;
            fStack_56c = fStack_5ac + fStack_46c;
            fStack_568 = fStack_5a8 + fStack_468;
            fStack_564 = fStack_5a4 + fStack_464;
            do {
              auVar165._8_4_ = 0x7f800000;
              auVar165._0_8_ = 0x7f8000007f800000;
              auVar165._12_4_ = 0x7f800000;
              auVar165._16_4_ = 0x7f800000;
              auVar165._20_4_ = 0x7f800000;
              auVar165._24_4_ = 0x7f800000;
              auVar165._28_4_ = 0x7f800000;
              auVar97 = vblendmps_avx512vl(auVar165,_local_6c0);
              auVar135._0_4_ =
                   (uint)(bVar76 & 1) * auVar97._0_4_ | (uint)!(bool)(bVar76 & 1) * 0x7f800000;
              bVar78 = (bool)(bVar76 >> 1 & 1);
              auVar135._4_4_ = (uint)bVar78 * auVar97._4_4_ | (uint)!bVar78 * 0x7f800000;
              bVar78 = (bool)(bVar76 >> 2 & 1);
              auVar135._8_4_ = (uint)bVar78 * auVar97._8_4_ | (uint)!bVar78 * 0x7f800000;
              bVar78 = (bool)(bVar76 >> 3 & 1);
              auVar135._12_4_ = (uint)bVar78 * auVar97._12_4_ | (uint)!bVar78 * 0x7f800000;
              bVar78 = (bool)(bVar76 >> 4 & 1);
              auVar135._16_4_ = (uint)bVar78 * auVar97._16_4_ | (uint)!bVar78 * 0x7f800000;
              bVar78 = (bool)(bVar76 >> 5 & 1);
              auVar135._20_4_ = (uint)bVar78 * auVar97._20_4_ | (uint)!bVar78 * 0x7f800000;
              auVar135._24_4_ =
                   (uint)(bVar76 >> 6) * auVar97._24_4_ | (uint)!(bool)(bVar76 >> 6) * 0x7f800000;
              auVar135._28_4_ = 0x7f800000;
              auVar97 = vshufps_avx(auVar135,auVar135,0xb1);
              auVar97 = vminps_avx(auVar135,auVar97);
              auVar96 = vshufpd_avx(auVar97,auVar97,5);
              auVar97 = vminps_avx(auVar97,auVar96);
              auVar96 = vpermpd_avx2(auVar97,0x4e);
              auVar97 = vminps_avx(auVar97,auVar96);
              uVar12 = vcmpps_avx512vl(auVar135,auVar97,0);
              bVar70 = (byte)uVar12 & bVar76;
              bVar71 = bVar76;
              if (bVar70 != 0) {
                bVar71 = bVar70;
              }
              iVar15 = 0;
              for (uVar81 = (uint)bVar71; (uVar81 & 1) == 0; uVar81 = uVar81 >> 1 | 0x80000000) {
                iVar15 = iVar15 + 1;
              }
              bVar71 = '\x01' << ((byte)iVar15 & 0x1f);
              uVar81 = *(uint *)(local_560 + (uint)(iVar15 << 2));
              uVar140 = *(uint *)(local_460 + (uint)(iVar15 << 2));
              fVar244 = local_8c4;
              if ((float)local_7e0._0_4_ < 0.0) {
                fVar244 = sqrtf((float)local_7e0._0_4_);
              }
              auVar249 = ZEXT464(uVar81);
              auVar241 = ZEXT464(uVar140);
              bVar70 = ~bVar71;
              lVar77 = 5;
              do {
                fVar245 = auVar241._0_4_;
                auVar154._4_4_ = fVar245;
                auVar154._0_4_ = fVar245;
                auVar154._8_4_ = fVar245;
                auVar154._12_4_ = fVar245;
                auVar84 = vfmadd132ps_fma(auVar154,ZEXT816(0) << 0x40,local_7d0);
                fVar248 = auVar249._0_4_;
                fVar232 = 1.0 - fVar248;
                fVar238 = fVar232 * fVar232 * fVar232;
                fVar246 = fVar248 * fVar248;
                fVar231 = fVar248 * fVar246;
                auVar85 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar238),
                                          ZEXT416((uint)fVar231));
                fVar237 = fVar248 * fVar232;
                auVar221 = ZEXT416((uint)fVar232);
                auVar1 = vfmadd231ss_fma(ZEXT416((uint)(fVar248 * fVar237 * 6.0)),
                                         ZEXT416((uint)(fVar237 * fVar232)),
                                         SUB6416(ZEXT464(0x41400000),0));
                auVar86 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar231),
                                          ZEXT416((uint)fVar238));
                auVar82 = vfmadd231ss_fma(ZEXT416((uint)(fVar237 * fVar232 * 6.0)),
                                          SUB6416(ZEXT464(0x41400000),0),
                                          ZEXT416((uint)(fVar248 * fVar237)));
                fVar238 = fVar238 * 0.16666667;
                fVar247 = (auVar85._0_4_ + auVar1._0_4_) * 0.16666667;
                fVar211 = (auVar86._0_4_ + auVar82._0_4_) * 0.16666667;
                fVar231 = fVar231 * 0.16666667;
                auVar200._0_4_ = fVar231 * (float)local_7c0._0_4_;
                auVar200._4_4_ = fVar231 * (float)local_7c0._4_4_;
                auVar200._8_4_ = fVar231 * fStack_7b8;
                auVar200._12_4_ = fVar231 * fStack_7b4;
                auVar224._4_4_ = fVar211;
                auVar224._0_4_ = fVar211;
                auVar224._8_4_ = fVar211;
                auVar224._12_4_ = fVar211;
                auVar85 = vfmadd132ps_fma(auVar224,auVar200,local_780._0_16_);
                auVar201._4_4_ = fVar247;
                auVar201._0_4_ = fVar247;
                auVar201._8_4_ = fVar247;
                auVar201._12_4_ = fVar247;
                auVar85 = vfmadd132ps_fma(auVar201,auVar85,local_7a0._0_16_);
                auVar180._4_4_ = fVar238;
                auVar180._0_4_ = fVar238;
                auVar180._8_4_ = fVar238;
                auVar180._12_4_ = fVar238;
                local_6d0 = vfmadd132ps_fma(auVar180,auVar85,local_760._0_16_);
                auVar84 = vsubps_avx(auVar84,local_6d0);
                local_800._0_16_ = auVar84;
                auVar84 = vdpps_avx(auVar84,auVar84,0x7f);
                auVar85 = auVar249._0_16_;
                local_820._0_16_ = auVar84;
                if (auVar84._0_4_ < 0.0) {
                  local_8c0._0_4_ = fVar246;
                  auVar233._0_4_ = sqrtf(auVar84._0_4_);
                  auVar233._4_60_ = extraout_var_00;
                  auVar84 = auVar233._0_16_;
                }
                else {
                  auVar84 = vsqrtss_avx(auVar84,auVar84);
                  local_8c0._0_4_ = fVar246;
                }
                auVar1 = vfnmsub213ss_fma(auVar85,auVar85,ZEXT416((uint)(fVar237 * 4.0)));
                auVar86 = vfmadd231ss_fma(ZEXT416((uint)(fVar237 * 4.0)),auVar221,auVar221);
                fVar246 = fVar232 * -fVar232 * 0.5;
                fVar237 = auVar1._0_4_ * 0.5;
                fVar238 = auVar86._0_4_ * 0.5;
                local_8c0._0_4_ = (float)local_8c0._0_4_ * 0.5;
                auVar214._0_4_ = (float)local_8c0._0_4_ * (float)local_7c0._0_4_;
                auVar214._4_4_ = (float)local_8c0._0_4_ * (float)local_7c0._4_4_;
                auVar214._8_4_ = (float)local_8c0._0_4_ * fStack_7b8;
                auVar214._12_4_ = (float)local_8c0._0_4_ * fStack_7b4;
                auVar181._4_4_ = fVar238;
                auVar181._0_4_ = fVar238;
                auVar181._8_4_ = fVar238;
                auVar181._12_4_ = fVar238;
                auVar86 = vfmadd132ps_fma(auVar181,auVar214,local_780._0_16_);
                auVar202._4_4_ = fVar237;
                auVar202._0_4_ = fVar237;
                auVar202._8_4_ = fVar237;
                auVar202._12_4_ = fVar237;
                auVar86 = vfmadd132ps_fma(auVar202,auVar86,local_7a0._0_16_);
                auVar255._4_4_ = fVar246;
                auVar255._0_4_ = fVar246;
                auVar255._8_4_ = fVar246;
                auVar255._12_4_ = fVar246;
                local_8c0._0_16_ = vfmadd132ps_fma(auVar255,auVar86,local_760._0_16_);
                local_6f0 = vdpps_avx(local_8c0._0_16_,local_8c0._0_16_,0x7f);
                auVar59._12_4_ = 0;
                auVar59._0_12_ = ZEXT812(0);
                fVar246 = local_6f0._0_4_;
                auVar86 = vrsqrt14ss_avx512f(auVar59 << 0x20,ZEXT416((uint)fVar246));
                fVar237 = auVar86._0_4_;
                local_700 = vrcp14ss_avx512f(auVar59 << 0x20,ZEXT416((uint)fVar246));
                auVar86 = vfnmadd213ss_fma(local_700,local_6f0,ZEXT416(0x40000000));
                uVar81 = auVar84._0_4_;
                local_6e0 = fVar232;
                fStack_6dc = fVar232;
                fStack_6d8 = fVar232;
                fStack_6d4 = fVar232;
                if (fVar246 < -fVar246) {
                  fVar238 = sqrtf(fVar246);
                  auVar84 = ZEXT416(uVar81);
                  auVar1 = local_8c0._0_16_;
                }
                else {
                  auVar1 = vsqrtss_avx(local_6f0,local_6f0);
                  fVar238 = auVar1._0_4_;
                  auVar1 = local_8c0._0_16_;
                }
                fVar246 = fVar237 * 1.5 + fVar246 * -0.5 * fVar237 * fVar237 * fVar237;
                auVar155._0_4_ = auVar1._0_4_ * fVar246;
                auVar155._4_4_ = auVar1._4_4_ * fVar246;
                auVar155._8_4_ = auVar1._8_4_ * fVar246;
                auVar155._12_4_ = auVar1._12_4_ * fVar246;
                auVar82 = vdpps_avx(local_800._0_16_,auVar155,0x7f);
                fVar211 = auVar84._0_4_;
                fVar237 = auVar82._0_4_;
                auVar156._0_4_ = fVar237 * fVar237;
                auVar156._4_4_ = auVar82._4_4_ * auVar82._4_4_;
                auVar156._8_4_ = auVar82._8_4_ * auVar82._8_4_;
                auVar156._12_4_ = auVar82._12_4_ * auVar82._12_4_;
                auVar83 = vsubps_avx512vl(local_820._0_16_,auVar156);
                fVar247 = auVar83._0_4_;
                auVar182._4_12_ = ZEXT812(0) << 0x20;
                auVar182._0_4_ = fVar247;
                auVar87 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar182);
                auVar88 = vmulss_avx512f(auVar87,ZEXT416(0x3fc00000));
                auVar89 = vmulss_avx512f(auVar83,ZEXT416(0xbf000000));
                if (fVar247 < 0.0) {
                  local_720 = fVar246;
                  fStack_71c = fVar246;
                  fStack_718 = fVar246;
                  fStack_714 = fVar246;
                  local_710 = auVar87;
                  fVar247 = sqrtf(fVar247);
                  auVar89 = ZEXT416(auVar89._0_4_);
                  auVar88 = ZEXT416(auVar88._0_4_);
                  auVar84 = ZEXT416(uVar81);
                  auVar1 = local_8c0._0_16_;
                  auVar87 = local_710;
                  fVar246 = local_720;
                  fVar231 = fStack_71c;
                  fVar232 = fStack_718;
                  fVar239 = fStack_714;
                }
                else {
                  auVar83 = vsqrtss_avx(auVar83,auVar83);
                  fVar247 = auVar83._0_4_;
                  fVar231 = fVar246;
                  fVar232 = fVar246;
                  fVar239 = fVar246;
                }
                auVar256 = ZEXT1664(auVar1);
                auVar243 = ZEXT1664(local_800._0_16_);
                auVar97 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                auVar260 = ZEXT3264(auVar97);
                auVar83 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),auVar221,auVar85);
                auVar85 = vfmadd231ss_fma(auVar221,auVar85,SUB6416(ZEXT464(0xc0000000),0));
                auVar203._0_4_ = fVar248 * (float)local_7c0._0_4_;
                auVar203._4_4_ = fVar248 * (float)local_7c0._4_4_;
                auVar203._8_4_ = fVar248 * fStack_7b8;
                auVar203._12_4_ = fVar248 * fStack_7b4;
                auVar215._0_4_ = auVar85._0_4_;
                auVar215._4_4_ = auVar215._0_4_;
                auVar215._8_4_ = auVar215._0_4_;
                auVar215._12_4_ = auVar215._0_4_;
                auVar85 = vfmadd132ps_fma(auVar215,auVar203,local_780._0_16_);
                auVar183._0_4_ = auVar83._0_4_;
                auVar183._4_4_ = auVar183._0_4_;
                auVar183._8_4_ = auVar183._0_4_;
                auVar183._12_4_ = auVar183._0_4_;
                auVar85 = vfmadd132ps_fma(auVar183,auVar85,local_7a0._0_16_);
                auVar65._4_4_ = fStack_6dc;
                auVar65._0_4_ = local_6e0;
                auVar65._8_4_ = fStack_6d8;
                auVar65._12_4_ = fStack_6d4;
                auVar85 = vfmadd132ps_fma(auVar65,auVar85,local_760._0_16_);
                auVar184._0_4_ = auVar85._0_4_ * (float)local_6f0._0_4_;
                auVar184._4_4_ = auVar85._4_4_ * (float)local_6f0._0_4_;
                auVar184._8_4_ = auVar85._8_4_ * (float)local_6f0._0_4_;
                auVar184._12_4_ = auVar85._12_4_ * (float)local_6f0._0_4_;
                auVar85 = vdpps_avx(auVar1,auVar85,0x7f);
                fVar192 = auVar85._0_4_;
                auVar204._0_4_ = auVar1._0_4_ * fVar192;
                auVar204._4_4_ = auVar1._4_4_ * fVar192;
                auVar204._8_4_ = auVar1._8_4_ * fVar192;
                auVar204._12_4_ = auVar1._12_4_ * fVar192;
                auVar85 = vsubps_avx(auVar184,auVar204);
                fVar192 = auVar86._0_4_ * (float)local_700._0_4_;
                auVar221 = vmaxss_avx(ZEXT416((uint)fVar242),
                                      ZEXT416((uint)(fVar245 * fVar244 * 1.9073486e-06)));
                auVar17._8_4_ = 0x80000000;
                auVar17._0_8_ = 0x8000000080000000;
                auVar17._12_4_ = 0x80000000;
                auVar137._16_16_ = auVar97._16_16_;
                auVar90 = vxorps_avx512vl(auVar1,auVar17);
                auVar205._0_4_ = fVar246 * auVar85._0_4_ * fVar192;
                auVar205._4_4_ = fVar231 * auVar85._4_4_ * fVar192;
                auVar205._8_4_ = fVar232 * auVar85._8_4_ * fVar192;
                auVar205._12_4_ = fVar239 * auVar85._12_4_ * fVar192;
                auVar251 = ZEXT1664(auVar155);
                auVar85 = vdpps_avx(auVar90,auVar155,0x7f);
                auVar86 = vfmadd213ss_fma(auVar84,ZEXT416((uint)fVar242),auVar221);
                auVar84 = vdpps_avx(local_800._0_16_,auVar205,0x7f);
                auVar83 = vfmadd213ss_fma(ZEXT416((uint)(fVar211 + 1.0)),
                                          ZEXT416((uint)(fVar242 / fVar238)),auVar86);
                auVar258 = ZEXT1664(auVar83);
                fVar246 = auVar85._0_4_ + auVar84._0_4_;
                auVar84 = vdpps_avx(local_7d0,auVar155,0x7f);
                auVar85 = vdpps_avx(local_800._0_16_,auVar90,0x7f);
                auVar86 = vmulss_avx512f(auVar89,auVar87);
                auVar89 = vaddss_avx512f(auVar88,ZEXT416((uint)(auVar86._0_4_ *
                                                               auVar87._0_4_ * auVar87._0_4_)));
                auVar86 = vdpps_avx(local_800._0_16_,local_7d0,0x7f);
                auVar87 = vfnmadd231ss_fma(auVar85,auVar82,ZEXT416((uint)fVar246));
                auVar88 = vfnmadd231ss_fma(auVar86,auVar82,auVar84);
                auVar85 = vpermilps_avx(local_6d0,0xff);
                fVar247 = fVar247 - auVar85._0_4_;
                auVar85 = vshufps_avx(auVar1,auVar1,0xff);
                auVar86 = vfmsub213ss_fma(auVar87,auVar89,auVar85);
                fVar238 = auVar88._0_4_ * auVar89._0_4_;
                auVar87 = vfmsub231ss_fma(ZEXT416((uint)(auVar84._0_4_ * auVar86._0_4_)),
                                          ZEXT416((uint)fVar246),ZEXT416((uint)fVar238));
                fVar211 = auVar87._0_4_;
                fVar238 = fVar237 * (fVar238 / fVar211) - fVar247 * (auVar84._0_4_ / fVar211);
                auVar233 = ZEXT464((uint)fVar238);
                fVar248 = fVar248 - fVar238;
                auVar249 = ZEXT464((uint)fVar248);
                fVar245 = fVar245 - (fVar247 * (fVar246 / fVar211) -
                                    fVar237 * (auVar86._0_4_ / fVar211));
                auVar241 = ZEXT464((uint)fVar245);
                auVar225._8_4_ = 0x7fffffff;
                auVar225._0_8_ = 0x7fffffff7fffffff;
                auVar225._12_4_ = 0x7fffffff;
                auVar84 = vandps_avx(auVar82,auVar225);
                bVar78 = true;
                if (auVar84._0_4_ < auVar83._0_4_) {
                  auVar86 = vfmadd231ss_fma(ZEXT416((uint)(auVar83._0_4_ + auVar221._0_4_)),
                                            local_740,ZEXT416(0x36000000));
                  auVar84 = vandps_avx(ZEXT416((uint)fVar247),auVar225);
                  if (auVar84._0_4_ < auVar86._0_4_) {
                    fVar245 = fVar245 + (float)local_730._0_4_;
                    auVar241 = ZEXT464((uint)fVar245);
                    if ((((fVar147 <= fVar245) &&
                         (fVar246 = *(float *)(ray + k * 4 + 0x80), fVar245 <= fVar246)) &&
                        (0.0 <= fVar248)) && (fVar248 <= 1.0)) {
                      auVar137._0_16_ = ZEXT816(0) << 0x20;
                      auVar136._4_28_ = auVar137._4_28_;
                      auVar136._0_4_ = local_820._0_4_;
                      auVar84 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x20,auVar136._0_16_);
                      fVar237 = auVar84._0_4_;
                      auVar84 = vmulss_avx512f(local_820._0_16_,ZEXT416(0xbf000000));
                      pGVar3 = (context->scene->geometries).items[local_858].ptr;
                      if ((pGVar3->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                        if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                           (pGVar3->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
                          bVar71 = true;
                        }
                        else {
                          fVar237 = fVar237 * 1.5 + auVar84._0_4_ * fVar237 * fVar237 * fVar237;
                          auVar185._0_4_ = local_800._0_4_ * fVar237;
                          auVar185._4_4_ = local_800._4_4_ * fVar237;
                          auVar185._8_4_ = local_800._8_4_ * fVar237;
                          auVar185._12_4_ = local_800._12_4_ * fVar237;
                          auVar82 = vfmadd213ps_fma(auVar85,auVar185,auVar1);
                          auVar84 = vshufps_avx(auVar185,auVar185,0xc9);
                          auVar85 = vshufps_avx(auVar1,auVar1,0xc9);
                          auVar186._0_4_ = auVar185._0_4_ * auVar85._0_4_;
                          auVar186._4_4_ = auVar185._4_4_ * auVar85._4_4_;
                          auVar186._8_4_ = auVar185._8_4_ * auVar85._8_4_;
                          auVar186._12_4_ = auVar185._12_4_ * auVar85._12_4_;
                          auVar86 = vfmsub231ps_fma(auVar186,auVar1,auVar84);
                          auVar84 = vshufps_avx(auVar86,auVar86,0xc9);
                          auVar85 = vshufps_avx(auVar82,auVar82,0xc9);
                          auVar86 = vshufps_avx(auVar86,auVar86,0xd2);
                          auVar157._0_4_ = auVar82._0_4_ * auVar86._0_4_;
                          auVar157._4_4_ = auVar82._4_4_ * auVar86._4_4_;
                          auVar157._8_4_ = auVar82._8_4_ * auVar86._8_4_;
                          auVar157._12_4_ = auVar82._12_4_ * auVar86._12_4_;
                          auVar84 = vfmsub231ps_fma(auVar157,auVar84,auVar85);
                          local_660 = (RTCHitN  [16])vshufps_avx(auVar84,auVar84,0x55);
                          auStack_650 = vshufps_avx(auVar84,auVar84,0xaa);
                          local_640 = auVar84._0_4_;
                          uStack_63c = local_640;
                          uStack_638 = local_640;
                          uStack_634 = local_640;
                          local_630 = fVar248;
                          fStack_62c = fVar248;
                          fStack_628 = fVar248;
                          fStack_624 = fVar248;
                          local_620 = ZEXT416(0) << 0x20;
                          local_610 = local_670._0_8_;
                          uStack_608 = local_670._8_8_;
                          local_600 = local_680;
                          vpcmpeqd_avx2(ZEXT1632(local_680),ZEXT1632(local_680));
                          uStack_5ec = context->user->instID[0];
                          local_5f0 = uStack_5ec;
                          uStack_5e8 = uStack_5ec;
                          uStack_5e4 = uStack_5ec;
                          uStack_5e0 = context->user->instPrimID[0];
                          uStack_5dc = uStack_5e0;
                          uStack_5d8 = uStack_5e0;
                          uStack_5d4 = uStack_5e0;
                          *(float *)(ray + k * 4 + 0x80) = fVar245;
                          local_8f0 = local_690._0_8_;
                          uStack_8e8 = local_690._8_8_;
                          local_850.valid = (int *)&local_8f0;
                          local_850.geometryUserPtr = pGVar3->userPtr;
                          local_850.context = context->user;
                          local_850.hit = local_660;
                          local_850.N = 4;
                          local_850.ray = (RTCRayN *)ray;
                          if (pGVar3->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                            auVar233 = ZEXT464((uint)fVar238);
                            auVar243 = ZEXT1664(local_800._0_16_);
                            auVar251 = ZEXT1664(auVar155);
                            auVar256 = ZEXT1664(auVar1);
                            auVar258 = ZEXT1664(auVar83);
                            (*pGVar3->occlusionFilterN)(&local_850);
                            auVar241 = ZEXT1664(ZEXT416((uint)fVar245));
                            auVar249 = ZEXT1664(ZEXT416((uint)fVar248));
                            auVar97 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                            auVar260 = ZEXT3264(auVar97);
                          }
                          auVar62._8_8_ = uStack_8e8;
                          auVar62._0_8_ = local_8f0;
                          uVar80 = vptestmd_avx512vl(auVar62,auVar62);
                          if ((uVar80 & 0xf) == 0) {
                            bVar71 = false;
                          }
                          else {
                            p_Var4 = context->args->filter;
                            if ((p_Var4 != (RTCFilterFunctionN)0x0) &&
                               (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER)
                                 != RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                (((pGVar3->field_8).field_0x2 & 0x40) != 0)))) {
                              auVar233 = ZEXT1664(auVar233._0_16_);
                              auVar243 = ZEXT1664(auVar243._0_16_);
                              auVar251 = ZEXT1664(auVar251._0_16_);
                              auVar256 = ZEXT1664(auVar256._0_16_);
                              auVar258 = ZEXT1664(auVar258._0_16_);
                              (*p_Var4)(&local_850);
                              auVar241 = ZEXT1664(ZEXT416((uint)fVar245));
                              auVar249 = ZEXT1664(ZEXT416((uint)fVar248));
                              auVar97 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                              auVar260 = ZEXT3264(auVar97);
                            }
                            auVar63._8_8_ = uStack_8e8;
                            auVar63._0_8_ = local_8f0;
                            uVar80 = vptestmd_avx512vl(auVar63,auVar63);
                            uVar80 = uVar80 & 0xf;
                            auVar84 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                            bVar78 = (bool)((byte)uVar80 & 1);
                            auVar91._0_4_ =
                                 (uint)bVar78 * auVar84._0_4_ |
                                 (uint)!bVar78 * *(int *)(local_850.ray + 0x80);
                            bVar78 = (bool)((byte)(uVar80 >> 1) & 1);
                            auVar91._4_4_ =
                                 (uint)bVar78 * auVar84._4_4_ |
                                 (uint)!bVar78 * *(int *)(local_850.ray + 0x84);
                            bVar78 = (bool)((byte)(uVar80 >> 2) & 1);
                            auVar91._8_4_ =
                                 (uint)bVar78 * auVar84._8_4_ |
                                 (uint)!bVar78 * *(int *)(local_850.ray + 0x88);
                            bVar78 = SUB81(uVar80 >> 3,0);
                            auVar91._12_4_ =
                                 (uint)bVar78 * auVar84._12_4_ |
                                 (uint)!bVar78 * *(int *)(local_850.ray + 0x8c);
                            *(undefined1 (*) [16])(local_850.ray + 0x80) = auVar91;
                            bVar71 = (byte)uVar80 != 0;
                          }
                          if ((bool)bVar71 == false) {
                            *(float *)(ray + k * 4 + 0x80) = fVar246;
                          }
                        }
                        bVar78 = false;
                        goto LAB_01d41f70;
                      }
                    }
                    bVar78 = false;
                    bVar71 = 0;
                  }
                }
LAB_01d41f70:
                if (!bVar78) goto LAB_01d42286;
                lVar77 = lVar77 + -1;
              } while (lVar77 != 0);
              bVar71 = 0;
LAB_01d42286:
              bVar73 = bVar73 | bVar71 & 1;
              auVar67._4_4_ = fStack_57c;
              auVar67._0_4_ = local_580;
              auVar67._8_4_ = fStack_578;
              auVar67._12_4_ = fStack_574;
              auVar67._16_4_ = fStack_570;
              auVar67._20_4_ = fStack_56c;
              auVar67._24_4_ = fStack_568;
              auVar67._28_4_ = fStack_564;
              uVar148 = *(undefined4 *)(ray + k * 4 + 0x80);
              auVar26._4_4_ = uVar148;
              auVar26._0_4_ = uVar148;
              auVar26._8_4_ = uVar148;
              auVar26._12_4_ = uVar148;
              auVar26._16_4_ = uVar148;
              auVar26._20_4_ = uVar148;
              auVar26._24_4_ = uVar148;
              auVar26._28_4_ = uVar148;
              uVar12 = vcmpps_avx512vl(auVar67,auVar26,2);
              bVar76 = bVar70 & bVar76 & (byte)uVar12;
            } while (bVar76 != 0);
          }
          uVar13 = vpcmpd_avx512vl(local_520,_local_5a0,1);
          uVar14 = vpcmpd_avx512vl(local_520,local_440,1);
          auVar187._0_4_ = (float)local_5c0._0_4_ + (float)local_1c0._0_4_;
          auVar187._4_4_ = (float)local_5c0._4_4_ + (float)local_1c0._4_4_;
          auVar187._8_4_ = fStack_5b8 + fStack_1b8;
          auVar187._12_4_ = fStack_5b4 + fStack_1b4;
          auVar187._16_4_ = fStack_5b0 + fStack_1b0;
          auVar187._20_4_ = fStack_5ac + fStack_1ac;
          auVar187._24_4_ = fStack_5a8 + fStack_1a8;
          auVar187._28_4_ = fStack_5a4 + fStack_1a4;
          uVar148 = *(undefined4 *)(ray + k * 4 + 0x80);
          auVar206._4_4_ = uVar148;
          auVar206._0_4_ = uVar148;
          auVar206._8_4_ = uVar148;
          auVar206._12_4_ = uVar148;
          auVar206._16_4_ = uVar148;
          auVar206._20_4_ = uVar148;
          auVar206._24_4_ = uVar148;
          auVar206._28_4_ = uVar148;
          uVar12 = vcmpps_avx512vl(auVar187,auVar206,2);
          bVar76 = (byte)local_8d0 & (byte)uVar14 & (byte)uVar12;
          auVar219._0_4_ = (float)local_5c0._0_4_ + (float)local_480._0_4_;
          auVar219._4_4_ = (float)local_5c0._4_4_ + (float)local_480._4_4_;
          auVar219._8_4_ = fStack_5b8 + fStack_478;
          auVar219._12_4_ = fStack_5b4 + fStack_474;
          auVar219._16_4_ = fStack_5b0 + fStack_470;
          auVar219._20_4_ = fStack_5ac + fStack_46c;
          auVar219._24_4_ = fStack_5a8 + fStack_468;
          auVar219._28_4_ = fStack_5a4 + fStack_464;
          uVar12 = vcmpps_avx512vl(auVar219,auVar206,2);
          bVar69 = bVar69 & (byte)uVar13 & (byte)uVar12 | bVar76;
          prim = local_870;
          pPVar75 = local_878;
          if (bVar69 == 0) {
            auVar220 = ZEXT3264(CONCAT428(0x3f800000,
                                          CONCAT424(0x3f800000,
                                                    CONCAT420(0x3f800000,
                                                              CONCAT416(0x3f800000,
                                                                        CONCAT412(0x3f800000,
                                                                                  CONCAT48(
                                                  0x3f800000,&DAT_3f8000003f800000)))))));
            auVar207 = ZEXT1664(local_890);
          }
          else {
            local_180[uVar72 * 0x60] = bVar69;
            auVar138._0_4_ =
                 (uint)(bVar76 & 1) * local_1c0._0_4_ | (uint)!(bool)(bVar76 & 1) * local_480._0_4_;
            bVar78 = (bool)(bVar76 >> 1 & 1);
            auVar138._4_4_ = (uint)bVar78 * local_1c0._4_4_ | (uint)!bVar78 * local_480._4_4_;
            bVar78 = (bool)(bVar76 >> 2 & 1);
            auVar138._8_4_ = (uint)bVar78 * (int)fStack_1b8 | (uint)!bVar78 * (int)fStack_478;
            bVar78 = (bool)(bVar76 >> 3 & 1);
            auVar138._12_4_ = (uint)bVar78 * (int)fStack_1b4 | (uint)!bVar78 * (int)fStack_474;
            bVar78 = (bool)(bVar76 >> 4 & 1);
            auVar138._16_4_ = (uint)bVar78 * (int)fStack_1b0 | (uint)!bVar78 * (int)fStack_470;
            bVar78 = (bool)(bVar76 >> 5 & 1);
            auVar138._20_4_ = (uint)bVar78 * (int)fStack_1ac | (uint)!bVar78 * (int)fStack_46c;
            bVar78 = (bool)(bVar76 >> 6 & 1);
            auVar138._24_4_ = (uint)bVar78 * (int)fStack_1a8 | (uint)!bVar78 * (int)fStack_468;
            auVar138._28_4_ =
                 (uint)(bVar76 >> 7) * (int)fStack_1a4 |
                 (uint)!(bool)(bVar76 >> 7) * (int)fStack_464;
            *(undefined1 (*) [32])(auStack_160 + uVar72 * 0x60) = auVar138;
            auVar207 = ZEXT1664(local_890);
            uVar12 = vmovlps_avx(local_890);
            *(undefined8 *)(local_140 + uVar72 * 0x18) = uVar12;
            local_138[uVar72 * 0x18] = (int)local_868 + 1;
            auVar220 = ZEXT3264(CONCAT428(0x3f800000,
                                          CONCAT424(0x3f800000,
                                                    CONCAT420(0x3f800000,
                                                              CONCAT416(0x3f800000,
                                                                        CONCAT412(0x3f800000,
                                                                                  CONCAT48(
                                                  0x3f800000,&DAT_3f8000003f800000)))))));
            uVar72 = (ulong)((int)uVar72 + 1);
          }
        }
      }
    }
    do {
      if ((int)uVar72 == 0) {
        if (bVar73 != 0) {
          return bVar79;
        }
        uVar148 = *(undefined4 *)(ray + k * 4 + 0x80);
        auVar28._4_4_ = uVar148;
        auVar28._0_4_ = uVar148;
        auVar28._8_4_ = uVar148;
        auVar28._12_4_ = uVar148;
        auVar28._16_4_ = uVar148;
        auVar28._20_4_ = uVar148;
        auVar28._24_4_ = uVar148;
        auVar28._28_4_ = uVar148;
        uVar12 = vcmpps_avx512vl(local_420,auVar28,2);
        uVar81 = (uint)local_860 & (uint)uVar12;
        local_860 = (ulong)uVar81;
        bVar79 = uVar81 != 0;
        if (!bVar79) {
          return bVar79;
        }
        goto LAB_01d3ff40;
      }
      uVar74 = (ulong)((int)uVar72 - 1);
      lVar77 = uVar74 * 0x60;
      auVar97 = *(undefined1 (*) [32])(auStack_160 + lVar77);
      auVar188._0_4_ = auVar97._0_4_ + (float)local_5c0._0_4_;
      auVar188._4_4_ = auVar97._4_4_ + (float)local_5c0._4_4_;
      auVar188._8_4_ = auVar97._8_4_ + fStack_5b8;
      auVar188._12_4_ = auVar97._12_4_ + fStack_5b4;
      auVar188._16_4_ = auVar97._16_4_ + fStack_5b0;
      auVar188._20_4_ = auVar97._20_4_ + fStack_5ac;
      auVar188._24_4_ = auVar97._24_4_ + fStack_5a8;
      auVar188._28_4_ = auVar97._28_4_ + fStack_5a4;
      uVar148 = *(undefined4 *)(ray + k * 4 + 0x80);
      auVar27._4_4_ = uVar148;
      auVar27._0_4_ = uVar148;
      auVar27._8_4_ = uVar148;
      auVar27._12_4_ = uVar148;
      auVar27._16_4_ = uVar148;
      auVar27._20_4_ = uVar148;
      auVar27._24_4_ = uVar148;
      auVar27._28_4_ = uVar148;
      uVar12 = vcmpps_avx512vl(auVar188,auVar27,2);
      uVar81 = (uint)uVar12 & (uint)local_180[lVar77];
      bVar69 = (byte)uVar81;
      uVar80 = uVar74;
      if (uVar81 != 0) {
        auVar189._8_4_ = 0x7f800000;
        auVar189._0_8_ = 0x7f8000007f800000;
        auVar189._12_4_ = 0x7f800000;
        auVar189._16_4_ = 0x7f800000;
        auVar189._20_4_ = 0x7f800000;
        auVar189._24_4_ = 0x7f800000;
        auVar189._28_4_ = 0x7f800000;
        auVar96 = vblendmps_avx512vl(auVar189,auVar97);
        auVar139._0_4_ =
             (uint)(bVar69 & 1) * auVar96._0_4_ | (uint)!(bool)(bVar69 & 1) * (int)auVar97._0_4_;
        bVar78 = (bool)((byte)(uVar81 >> 1) & 1);
        auVar139._4_4_ = (uint)bVar78 * auVar96._4_4_ | (uint)!bVar78 * (int)auVar97._4_4_;
        bVar78 = (bool)((byte)(uVar81 >> 2) & 1);
        auVar139._8_4_ = (uint)bVar78 * auVar96._8_4_ | (uint)!bVar78 * (int)auVar97._8_4_;
        bVar78 = (bool)((byte)(uVar81 >> 3) & 1);
        auVar139._12_4_ = (uint)bVar78 * auVar96._12_4_ | (uint)!bVar78 * (int)auVar97._12_4_;
        bVar78 = (bool)((byte)(uVar81 >> 4) & 1);
        auVar139._16_4_ = (uint)bVar78 * auVar96._16_4_ | (uint)!bVar78 * (int)auVar97._16_4_;
        bVar78 = (bool)((byte)(uVar81 >> 5) & 1);
        auVar139._20_4_ = (uint)bVar78 * auVar96._20_4_ | (uint)!bVar78 * (int)auVar97._20_4_;
        bVar78 = (bool)((byte)(uVar81 >> 6) & 1);
        auVar139._24_4_ = (uint)bVar78 * auVar96._24_4_ | (uint)!bVar78 * (int)auVar97._24_4_;
        auVar139._28_4_ =
             (uVar81 >> 7) * auVar96._28_4_ | (uint)!SUB41(uVar81 >> 7,0) * (int)auVar97._28_4_;
        auVar97 = vshufps_avx(auVar139,auVar139,0xb1);
        auVar97 = vminps_avx(auVar139,auVar97);
        auVar96 = vshufpd_avx(auVar97,auVar97,5);
        auVar97 = vminps_avx(auVar97,auVar96);
        auVar96 = vpermpd_avx2(auVar97,0x4e);
        auVar97 = vminps_avx(auVar97,auVar96);
        uVar12 = vcmpps_avx512vl(auVar139,auVar97,0);
        bVar76 = (byte)uVar12 & bVar69;
        if (bVar76 != 0) {
          uVar81 = (uint)bVar76;
        }
        fVar242 = local_140[uVar74 * 0x18 + 1];
        uVar140 = 0;
        for (; (uVar81 & 1) == 0; uVar81 = uVar81 >> 1 | 0x80000000) {
          uVar140 = uVar140 + 1;
        }
        local_868 = (ulong)local_138[uVar74 * 0x18];
        bVar76 = ~('\x01' << ((byte)uVar140 & 0x1f)) & bVar69;
        local_180[lVar77] = bVar76;
        if (bVar76 != 0) {
          uVar80 = uVar72;
        }
        fVar244 = local_140[uVar74 * 0x18];
        auVar190._4_4_ = fVar244;
        auVar190._0_4_ = fVar244;
        auVar190._8_4_ = fVar244;
        auVar190._12_4_ = fVar244;
        auVar190._16_4_ = fVar244;
        auVar190._20_4_ = fVar244;
        auVar190._24_4_ = fVar244;
        auVar190._28_4_ = fVar244;
        fVar242 = fVar242 - fVar244;
        auVar166._4_4_ = fVar242;
        auVar166._0_4_ = fVar242;
        auVar166._8_4_ = fVar242;
        auVar166._12_4_ = fVar242;
        auVar166._16_4_ = fVar242;
        auVar166._20_4_ = fVar242;
        auVar166._24_4_ = fVar242;
        auVar166._28_4_ = fVar242;
        auVar84 = vfmadd132ps_fma(auVar166,auVar190,_DAT_02020f20);
        _local_660 = ZEXT1632(auVar84);
        auVar207 = ZEXT864(*(ulong *)(local_660 + (ulong)uVar140 * 4));
      }
      uVar72 = uVar80;
    } while (bVar69 == 0);
  } while( true );
}

Assistant:

static __forceinline bool occluded_t(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = CurveNiIntersectorK<M,K>::intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = (CurveGeometry*) context->scene->get(geomID);
          const Vec3ff a0 = Vec3ff::loadu(&prim.vertices(i,N)[0]);
          const Vec3ff a1 = Vec3ff::loadu(&prim.vertices(i,N)[1]);
          const Vec3ff a2 = Vec3ff::loadu(&prim.vertices(i,N)[2]);
          const Vec3ff a3 = Vec3ff::loadu(&prim.vertices(i,N)[3]);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            prefetchL1(&prim.vertices(i1,N)[0]);
            prefetchL1(&prim.vertices(i1,N)[4]);
            if (mask1) {
              const size_t i2 = bsf(mask1);
              prefetchL2(&prim.vertices(i2,N)[0]);
              prefetchL2(&prim.vertices(i2,N)[4]);
            }
          }

          if (Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID)))
            return true;

          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }